

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_intersector.cpp
# Opt level: O3

void embree::sse42::InstanceIntersectorKMB<4>::intersect
               (vbool<4> *valid_i,Precalculations *pre,RayHitK<4> *ray,RayQueryContext *context,
               Primitive *prim)

{
  RayHitK<4> *pRVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  Vector *pVVar4;
  Vector *pVVar5;
  Vector *pVVar6;
  Vector *pVVar7;
  int iVar8;
  Instance *pIVar9;
  RTCRayQueryContext *pRVar10;
  AffineSpace3ff *pAVar11;
  AffineSpace3ff *pAVar12;
  AffineSpace3ff *pAVar13;
  long lVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  ulong uVar19;
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [16];
  uint uVar27;
  int iVar28;
  float fVar29;
  uint uVar30;
  float fVar51;
  float fVar54;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar57;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  uint uVar52;
  uint uVar55;
  uint uVar58;
  undefined1 auVar38 [16];
  uint uVar53;
  uint uVar56;
  uint uVar59;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar60;
  float fVar77;
  float fVar78;
  undefined1 auVar61 [16];
  float fVar79;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar80;
  float fVar100;
  float fVar101;
  undefined1 auVar81 [16];
  float fVar102;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar103;
  float fVar111;
  float fVar112;
  float fVar113;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar114;
  float fVar126;
  float fVar127;
  undefined1 in_XMM4 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar128;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  float fVar160;
  float fVar190;
  float fVar191;
  undefined1 in_XMM6 [16];
  float fVar192;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar193;
  float fVar201;
  float fVar202;
  undefined1 in_XMM7 [16];
  float fVar204;
  undefined1 auVar194 [16];
  float fVar203;
  float fVar205;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  float fVar211;
  float fVar212;
  float fVar220;
  float fVar221;
  undefined1 in_XMM9 [16];
  float fVar222;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar223;
  float fVar227;
  float fVar228;
  undefined1 in_XMM10 [16];
  float fVar229;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar230;
  float fVar234;
  float fVar235;
  undefined1 auVar231 [16];
  float fVar236;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar237;
  float fVar245;
  float fVar246;
  undefined1 in_XMM12 [16];
  float fVar247;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar248;
  float fVar251;
  float fVar252;
  undefined1 in_XMM13 [16];
  float fVar253;
  undefined1 auVar249 [16];
  float fVar254;
  float fVar255;
  undefined1 auVar250 [16];
  float fVar256;
  float fVar257;
  float fVar258;
  undefined8 uVar259;
  float fVar268;
  undefined1 in_XMM14 [16];
  float fVar265;
  float fVar271;
  float fVar272;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  float fVar266;
  float fVar267;
  float fVar269;
  float fVar270;
  float fVar273;
  float fVar274;
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  int iVar275;
  int iVar283;
  int iVar286;
  undefined1 in_XMM15 [16];
  int iVar289;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar284;
  float fVar287;
  float fVar290;
  undefined1 auVar279 [16];
  float fVar285;
  float fVar288;
  float fVar291;
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  RayQueryContext newcontext;
  undefined1 local_258 [8];
  undefined8 uStack_250;
  undefined1 local_248 [8];
  undefined8 uStack_240;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  undefined1 local_228 [8];
  undefined8 uStack_220;
  undefined1 local_218 [8];
  undefined8 uStack_210;
  undefined1 local_208 [8];
  undefined8 uStack_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [8];
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [8];
  float fStack_160;
  float fStack_15c;
  undefined1 local_158 [8];
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  float local_138;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float fStack_114;
  float local_108;
  undefined1 local_f8 [8];
  float fStack_f0;
  float fStack_ec;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [8];
  float fStack_d0;
  float fStack_cc;
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  RTCIntersectArguments *local_88;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  pIVar9 = prim->instance;
  uVar27 = (pIVar9->super_Geometry).mask;
  auVar231._0_4_ = -(uint)((uVar27 & *(uint *)(ray + 0x90)) == 0);
  auVar231._4_4_ = -(uint)((uVar27 & *(uint *)(ray + 0x94)) == 0);
  auVar231._8_4_ = -(uint)((uVar27 & *(uint *)(ray + 0x98)) == 0);
  auVar231._12_4_ = -(uint)((uVar27 & *(uint *)(ray + 0x9c)) == 0);
  auVar231 = ~auVar231 & (undefined1  [16])valid_i->field_0;
  uVar27 = movmskps((int)pre,auVar231);
  if ((uVar27 != 0) && (pRVar10 = context->user, pRVar10->instID[0] == 0xffffffff)) {
    pRVar10->instID[0] = prim->instID_;
    pRVar10->instPrimID[0] = 0;
    local_48 = auVar231;
    auVar26 = local_48;
    local_48._0_8_ = auVar231._0_8_;
    local_48._8_8_ = auVar231._8_8_;
    if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
      fVar114 = (pIVar9->super_Geometry).fnumTimeSegments;
      fVar126 = (pIVar9->super_Geometry).time_range.lower;
      auVar130._0_4_ = (pIVar9->super_Geometry).time_range.upper - fVar126;
      auVar83._4_4_ = fVar126;
      auVar83._0_4_ = fVar126;
      auVar83._8_4_ = fVar126;
      auVar83._12_4_ = fVar126;
      auVar119._4_4_ = fVar114;
      auVar119._0_4_ = fVar114;
      auVar119._8_4_ = fVar114;
      auVar119._12_4_ = fVar114;
      auVar214._0_4_ = *(float *)(ray + 0x70) - fVar126;
      auVar214._4_4_ = *(float *)(ray + 0x74) - fVar126;
      auVar214._8_4_ = *(float *)(ray + 0x78) - fVar126;
      auVar214._12_4_ = *(float *)(ray + 0x7c) - fVar126;
      auVar130._4_4_ = auVar130._0_4_;
      auVar130._8_4_ = auVar130._0_4_;
      auVar130._12_4_ = auVar130._0_4_;
      auVar116 = divps(auVar214,auVar130);
      auVar239._0_4_ = auVar116._0_4_ * fVar114;
      auVar239._4_4_ = auVar116._4_4_ * fVar114;
      auVar239._8_4_ = auVar116._8_4_ * fVar114;
      auVar239._12_4_ = auVar116._12_4_ * fVar114;
      auVar83 = roundps(auVar83,auVar239,1);
      auVar116._0_4_ = fVar114 + -1.0;
      auVar116._4_4_ = auVar116._0_4_;
      auVar116._8_4_ = auVar116._0_4_;
      auVar116._12_4_ = auVar116._0_4_;
      auVar116 = minps(auVar83,auVar116);
      auVar105._0_12_ = ZEXT812(0);
      auVar105._12_4_ = 0;
      auVar116 = maxps(auVar116,auVar105);
      fVar114 = auVar239._0_4_ - auVar116._0_4_;
      fVar126 = auVar239._4_4_ - auVar116._4_4_;
      fVar127 = auVar239._8_4_ - auVar116._8_4_;
      fVar128 = auVar239._12_4_ - auVar116._12_4_;
      iVar275 = (int)auVar116._0_4_;
      iVar283 = (int)auVar116._4_4_;
      iVar286 = (int)auVar116._8_4_;
      iVar289 = (int)auVar116._12_4_;
      local_98 = CONCAT44(iVar283,iVar275);
      uStack_90 = (RTCRayQueryContext *)CONCAT44(iVar289,iVar286);
      lVar14 = 0;
      if ((uVar27 & 0xff) != 0) {
        for (; ((uVar27 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      iVar8 = *(int *)((long)&local_98 + lVar14 * 4);
      auVar277._0_4_ = -(uint)(iVar8 == iVar275);
      auVar277._4_4_ = -(uint)(iVar8 == iVar283);
      auVar277._8_4_ = -(uint)(iVar8 == iVar286);
      auVar277._12_4_ = -(uint)(iVar8 == iVar289);
      iVar28 = movmskps((int)valid_i,~auVar277 & auVar231);
      if (iVar28 == 0) {
        pAVar12 = pIVar9->local2world;
        pAVar13 = pAVar12 + iVar8;
        fVar103 = (pAVar13->l).vx.field_0.m128[1];
        fVar111 = (pAVar13->l).vx.field_0.m128[2];
        fVar203 = (pAVar13->l).vx.field_0.m128[3];
        pVVar2 = &pAVar12[iVar8].p;
        fVar205 = (pVVar2->field_0).m128[1];
        fVar212 = (pVVar2->field_0).m128[2];
        local_58 = *(float *)((long)&pVVar2->field_0 + 0xc);
        pAVar11 = pAVar12 + (long)iVar8 + 1;
        fVar112 = (pAVar11->l).vx.field_0.m128[3];
        auVar278._4_4_ = fVar112;
        auVar278._0_4_ = fVar112;
        auVar278._8_4_ = fVar112;
        auVar278._12_4_ = fVar112;
        pVVar3 = &pAVar12[(long)iVar8 + 1].p;
        fVar113 = *(float *)((long)&pVVar3->field_0 + 0xc);
        auVar215._4_4_ = fVar113;
        auVar215._0_4_ = fVar113;
        auVar215._8_4_ = fVar113;
        auVar215._12_4_ = fVar113;
        pVVar4 = &pAVar12[iVar8].l.vy;
        fVar247 = (pVVar4->field_0).m128[1];
        fVar29 = (pVVar4->field_0).m128[2];
        fVar51 = *(float *)((long)&pVVar4->field_0 + 0xc);
        pVVar5 = &pAVar12[(long)iVar8 + 1].l.vy;
        fVar57 = *(float *)((long)&pVVar5->field_0 + 0xc);
        auVar224._4_4_ = fVar57;
        auVar224._0_4_ = fVar57;
        auVar224._8_4_ = fVar57;
        auVar224._12_4_ = fVar57;
        pVVar6 = &pAVar12[iVar8].l.vz;
        fVar272 = (pVVar6->field_0).m128[1];
        fVar54 = (pVVar6->field_0).m128[2];
        fVar60 = *(float *)((long)&pVVar6->field_0 + 0xc);
        pVVar7 = &pAVar12[(long)iVar8 + 1].l.vz;
        fVar77 = *(float *)((long)&pVVar7->field_0 + 0xc);
        auVar249._4_4_ = fVar77;
        auVar249._0_4_ = fVar77;
        auVar249._8_4_ = fVar77;
        auVar249._12_4_ = fVar77;
        auVar106._0_4_ = fVar60 * fVar77 + fVar51 * fVar57 + fVar203 * fVar112 + local_58 * fVar113;
        auVar106._4_4_ = fVar60 * fVar77 + fVar51 * fVar57 + fVar203 * fVar112 + local_58 * fVar113;
        auVar106._8_4_ = fVar60 * fVar77 + fVar51 * fVar57 + fVar203 * fVar112 + local_58 * fVar113;
        auVar106._12_4_ = fVar60 * fVar77 + fVar51 * fVar57 + fVar203 * fVar112 + local_58 * fVar113
        ;
        uVar19 = CONCAT44(auVar106._4_4_,auVar106._0_4_);
        auVar33._4_4_ = -(uint)(auVar106._4_4_ < -auVar106._4_4_);
        auVar33._0_4_ = -(uint)(auVar106._0_4_ < -auVar106._0_4_);
        auVar33._8_4_ = -(uint)(auVar106._8_4_ < -auVar106._8_4_);
        auVar33._12_4_ = -(uint)(auVar106._12_4_ < -auVar106._12_4_);
        auVar240._8_4_ = -auVar106._8_4_;
        auVar240._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar240._12_4_ = -auVar106._12_4_;
        auVar63._0_8_ = CONCAT44(fVar113,fVar113) ^ 0x8000000080000000;
        auVar63._8_4_ = -fVar113;
        auVar63._12_4_ = -fVar113;
        auVar83 = blendvps(auVar215,auVar63,auVar33);
        auVar64._0_8_ = CONCAT44(fVar112,fVar112) ^ 0x8000000080000000;
        auVar64._8_4_ = -fVar112;
        auVar64._12_4_ = -fVar112;
        auVar214 = blendvps(auVar278,auVar64,auVar33);
        auVar65._0_8_ = CONCAT44(fVar57,fVar57) ^ 0x8000000080000000;
        auVar65._8_4_ = -fVar57;
        auVar65._12_4_ = -fVar57;
        auVar130 = blendvps(auVar224,auVar65,auVar33);
        auVar66._0_8_ = CONCAT44(fVar77,fVar77) ^ 0x8000000080000000;
        auVar66._8_4_ = -fVar77;
        auVar66._12_4_ = -fVar77;
        auVar105 = blendvps(auVar249,auVar66,auVar33);
        local_78 = maxps(auVar240,auVar106);
        fVar112 = ABS(auVar106._0_4_);
        fVar113 = ABS(auVar106._4_4_);
        uVar19 = CONCAT44(auVar106._4_4_,auVar106._0_4_);
        auVar107._0_8_ = uVar19 & 0x7fffffff7fffffff;
        auVar107._8_4_ = ABS(auVar106._8_4_);
        auVar107._12_4_ = ABS(auVar106._12_4_);
        auVar67._0_4_ = 1.0 - fVar112;
        auVar67._4_4_ = 1.0 - fVar113;
        auVar67._8_4_ = 1.0 - auVar107._8_4_;
        auVar67._12_4_ = 1.0 - auVar107._12_4_;
        auVar231 = sqrtps(auVar67,auVar67);
        auVar34._0_4_ =
             1.5707964 -
             auVar231._0_4_ *
             (((((fVar112 * -0.0043095737 + 0.0192803) * fVar112 + -0.04489909) * fVar112 +
               0.08785567) * fVar112 + -0.21450998) * fVar112 + 1.5707952);
        auVar34._4_4_ =
             1.5707964 -
             auVar231._4_4_ *
             (((((fVar113 * -0.0043095737 + 0.0192803) * fVar113 + -0.04489909) * fVar113 +
               0.08785567) * fVar113 + -0.21450998) * fVar113 + 1.5707952);
        auVar34._8_4_ =
             1.5707964 -
             auVar231._8_4_ *
             (((((auVar107._8_4_ * -0.0043095737 + 0.0192803) * auVar107._8_4_ + -0.04489909) *
                auVar107._8_4_ + 0.08785567) * auVar107._8_4_ + -0.21450998) * auVar107._8_4_ +
             1.5707952);
        auVar34._12_4_ =
             1.5707964 -
             auVar231._12_4_ *
             (((((auVar107._12_4_ * -0.0043095737 + 0.0192803) * auVar107._12_4_ + -0.04489909) *
                auVar107._12_4_ + 0.08785567) * auVar107._12_4_ + -0.21450998) * auVar107._12_4_ +
             1.5707952);
        auVar231 = maxps(ZEXT816(0),auVar34);
        fVar228 = local_78._0_4_;
        fVar230 = local_78._4_4_;
        fVar235 = local_78._8_4_;
        fVar237 = local_78._12_4_;
        auVar35._4_4_ = -(uint)(fVar230 < 0.0);
        auVar35._0_4_ = -(uint)(fVar228 < 0.0);
        auVar35._8_4_ = -(uint)(fVar235 < 0.0);
        auVar35._12_4_ = -(uint)(fVar237 < 0.0);
        auVar68._0_8_ = auVar231._0_8_ ^ 0x8000000080000000;
        auVar68._8_4_ = auVar231._8_4_ ^ 0x80000000;
        auVar68._12_4_ = auVar231._12_4_ ^ 0x80000000;
        auVar231 = blendvps(auVar231,auVar68,auVar35);
        auVar69._0_4_ = 1.5707964 - auVar231._0_4_;
        auVar69._4_4_ = 1.5707964 - auVar231._4_4_;
        auVar69._8_4_ = 1.5707964 - auVar231._8_4_;
        auVar69._12_4_ = 1.5707964 - auVar231._12_4_;
        auVar36._4_4_ = -(uint)(1.0 < fVar113);
        auVar36._0_4_ = -(uint)(1.0 < fVar112);
        auVar36._8_4_ = -(uint)(1.0 < auVar107._8_4_);
        auVar36._12_4_ = -(uint)(1.0 < auVar107._12_4_);
        auVar231 = blendvps(auVar69,_DAT_01f80c30,auVar36);
        fVar112 = auVar231._0_4_ * fVar114;
        fVar113 = auVar231._4_4_ * fVar126;
        fVar57 = auVar231._8_4_ * fVar127;
        fVar77 = auVar231._12_4_ * fVar128;
        auVar37._0_4_ = fVar112 * 0.63661975;
        auVar37._4_4_ = fVar113 * 0.63661975;
        auVar37._8_4_ = fVar57 * 0.63661975;
        auVar37._12_4_ = fVar77 * 0.63661975;
        auVar231 = roundps(auVar107,auVar37,1);
        uVar27 = (uint)auVar231._0_4_;
        uVar52 = (uint)auVar231._4_4_;
        uVar55 = (uint)auVar231._8_4_;
        uVar58 = (uint)auVar231._12_4_;
        fVar112 = fVar112 - auVar231._0_4_ * 1.5707964;
        fVar113 = fVar113 - auVar231._4_4_ * 1.5707964;
        fVar57 = fVar57 - auVar231._8_4_ * 1.5707964;
        fVar77 = fVar77 - auVar231._12_4_ * 1.5707964;
        uVar30 = uVar27 & 3;
        uVar53 = uVar52 & 3;
        uVar56 = uVar55 & 3;
        uVar59 = uVar58 & 3;
        fVar78 = fVar112 * fVar112;
        fVar79 = fVar113 * fVar113;
        fVar80 = fVar57 * fVar57;
        fVar100 = fVar77 * fVar77;
        uVar27 = uVar27 & 1;
        uVar52 = uVar52 & 1;
        uVar55 = uVar55 & 1;
        uVar58 = uVar58 & 1;
        auVar120._0_4_ = -(uint)(uVar27 == 0);
        auVar120._4_4_ = -(uint)(uVar52 == 0);
        auVar120._8_4_ = -(uint)(uVar55 == 0);
        auVar120._12_4_ = -(uint)(uVar58 == 0);
        auVar84._4_4_ = -uVar52;
        auVar84._0_4_ = -uVar27;
        auVar84._8_4_ = -uVar55;
        auVar84._12_4_ = -uVar58;
        auVar260._0_8_ =
             CONCAT44((((((fVar79 * -2.5029328e-08 + 2.7600126e-06) * fVar79 + -0.00019842605) *
                         fVar79 + 0.008333348) * fVar79 + -0.16666667) * fVar79 + 1.0) * fVar113,
                      (((((fVar78 * -2.5029328e-08 + 2.7600126e-06) * fVar78 + -0.00019842605) *
                         fVar78 + 0.008333348) * fVar78 + -0.16666667) * fVar78 + 1.0) * fVar112);
        auVar260._8_4_ =
             (((((fVar80 * -2.5029328e-08 + 2.7600126e-06) * fVar80 + -0.00019842605) * fVar80 +
               0.008333348) * fVar80 + -0.16666667) * fVar80 + 1.0) * fVar57;
        auVar260._12_4_ =
             (((((fVar100 * -2.5029328e-08 + 2.7600126e-06) * fVar100 + -0.00019842605) * fVar100 +
               0.008333348) * fVar100 + -0.16666667) * fVar100 + 1.0) * fVar77;
        auVar206._0_4_ =
             ((((fVar78 * -2.5963018e-07 + 2.4756235e-05) * fVar78 + -0.001388833) * fVar78 +
              0.04166664) * fVar78 + -0.5) * fVar78 + 1.0;
        auVar206._4_4_ =
             ((((fVar79 * -2.5963018e-07 + 2.4756235e-05) * fVar79 + -0.001388833) * fVar79 +
              0.04166664) * fVar79 + -0.5) * fVar79 + 1.0;
        auVar206._8_4_ =
             ((((fVar80 * -2.5963018e-07 + 2.4756235e-05) * fVar80 + -0.001388833) * fVar80 +
              0.04166664) * fVar80 + -0.5) * fVar80 + 1.0;
        auVar206._12_4_ =
             ((((fVar100 * -2.5963018e-07 + 2.4756235e-05) * fVar100 + -0.001388833) * fVar100 +
              0.04166664) * fVar100 + -0.5) * fVar100 + 1.0;
        auVar131._8_4_ = auVar260._8_4_;
        auVar131._0_8_ = auVar260._0_8_;
        auVar131._12_4_ = auVar260._12_4_;
        auVar231 = blendvps(auVar131,auVar206,auVar84);
        auVar119 = blendvps(auVar260,auVar206,auVar120);
        auVar38._0_4_ = -(uint)(1 < uVar30);
        auVar38._4_4_ = -(uint)(1 < uVar53);
        auVar38._8_4_ = -(uint)(1 < uVar56);
        auVar38._12_4_ = -(uint)(1 < uVar59);
        auVar70._0_8_ = auVar231._0_8_ ^ 0x8000000080000000;
        auVar70._8_4_ = auVar231._8_4_ ^ 0x80000000;
        auVar70._12_4_ = auVar231._12_4_ ^ 0x80000000;
        auVar116 = blendvps(auVar231,auVar70,auVar38);
        uVar30 = uVar30 - 1;
        uVar53 = uVar53 - 1;
        uVar56 = uVar56 - 1;
        uVar59 = uVar59 - 1;
        auVar108._0_4_ = -(uint)(((uVar30 == 0) * uVar30 | (uint)(uVar30 != 0)) == uVar30);
        auVar108._4_4_ = -(uint)(((uVar53 == 0) * uVar53 | (uint)(uVar53 != 0)) == uVar53);
        auVar108._8_4_ = -(uint)(((uVar56 == 0) * uVar56 | (uint)(uVar56 != 0)) == uVar56);
        auVar108._12_4_ = -(uint)(((uVar59 == 0) * uVar59 | (uint)(uVar59 != 0)) == uVar59);
        auVar162._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
        auVar162._8_4_ = auVar119._8_4_ ^ 0x80000000;
        auVar162._12_4_ = auVar119._12_4_ ^ 0x80000000;
        auVar119 = blendvps(auVar119,auVar162,auVar108);
        fVar202 = local_58 * fVar228 - auVar83._0_4_;
        fVar204 = local_58 * fVar230 - auVar83._4_4_;
        fVar211 = local_58 * fVar235 - auVar83._8_4_;
        fVar220 = local_58 * fVar237 - auVar83._12_4_;
        fVar112 = fVar203 * fVar228 - auVar214._0_4_;
        fVar113 = fVar203 * fVar230 - auVar214._4_4_;
        fVar57 = fVar203 * fVar235 - auVar214._8_4_;
        fVar77 = fVar203 * fVar237 - auVar214._12_4_;
        fVar78 = fVar51 * fVar228 - auVar130._0_4_;
        fVar79 = fVar51 * fVar230 - auVar130._4_4_;
        fVar80 = fVar51 * fVar235 - auVar130._8_4_;
        fVar100 = fVar51 * fVar237 - auVar130._12_4_;
        local_68 = fVar60 * fVar228 - auVar105._0_4_;
        fStack_64 = fVar60 * fVar230 - auVar105._4_4_;
        fStack_60 = fVar60 * fVar235 - auVar105._8_4_;
        fStack_5c = fVar60 * fVar237 - auVar105._12_4_;
        auVar71._0_4_ =
             local_68 * local_68 + fVar78 * fVar78 + fVar112 * fVar112 + fVar202 * fVar202;
        auVar71._4_4_ =
             fStack_64 * fStack_64 + fVar79 * fVar79 + fVar113 * fVar113 + fVar204 * fVar204;
        auVar71._8_4_ =
             fStack_60 * fStack_60 + fVar80 * fVar80 + fVar57 * fVar57 + fVar211 * fVar211;
        auVar71._12_4_ =
             fStack_5c * fStack_5c + fVar100 * fVar100 + fVar77 * fVar77 + fVar220 * fVar220;
        auVar231 = rsqrtps(auVar120,auVar71);
        fVar101 = auVar231._0_4_;
        fVar102 = auVar231._4_4_;
        fVar160 = auVar231._8_4_;
        fVar190 = auVar231._12_4_;
        fVar229 = fVar101 * 1.5 - fVar101 * fVar101 * auVar71._0_4_ * 0.5 * fVar101;
        fVar234 = fVar102 * 1.5 - fVar102 * fVar102 * auVar71._4_4_ * 0.5 * fVar102;
        fVar236 = fVar160 * 1.5 - fVar160 * fVar160 * auVar71._8_4_ * 0.5 * fVar160;
        fVar245 = fVar190 * 1.5 - fVar190 * fVar190 * auVar71._12_4_ * 0.5 * fVar190;
        fVar191 = auVar116._0_4_;
        fVar192 = auVar116._4_4_;
        fVar193 = auVar116._8_4_;
        fVar201 = auVar116._12_4_;
        fVar221 = (auVar83._0_4_ - local_58) * fVar114 + local_58;
        fVar222 = (auVar83._4_4_ - local_58) * fVar126 + local_58;
        fVar223 = (auVar83._8_4_ - local_58) * fVar127 + local_58;
        fVar227 = (auVar83._12_4_ - local_58) * fVar128 + local_58;
        fVar253 = auVar119._0_4_;
        fVar256 = auVar119._4_4_;
        fVar265 = auVar119._8_4_;
        fVar268 = auVar119._12_4_;
        auVar72._0_4_ = local_58 * fVar253 - fVar202 * fVar229 * fVar191;
        auVar72._4_4_ = local_58 * fVar256 - fVar204 * fVar234 * fVar192;
        auVar72._8_4_ = local_58 * fVar265 - fVar211 * fVar236 * fVar193;
        auVar72._12_4_ = local_58 * fVar268 - fVar220 * fVar245 * fVar201;
        fVar271 = (auVar214._0_4_ - fVar203) * fVar114 + fVar203;
        fVar284 = (auVar214._4_4_ - fVar203) * fVar126 + fVar203;
        fVar287 = (auVar214._8_4_ - fVar203) * fVar127 + fVar203;
        fVar290 = (auVar214._12_4_ - fVar203) * fVar128 + fVar203;
        fVar202 = (auVar130._0_4_ - fVar51) * fVar114 + fVar51;
        fVar204 = (auVar130._4_4_ - fVar51) * fVar126 + fVar51;
        fVar211 = (auVar130._8_4_ - fVar51) * fVar127 + fVar51;
        fVar220 = (auVar130._12_4_ - fVar51) * fVar128 + fVar51;
        auVar121._0_4_ = fVar202 * fVar202 + fVar271 * fVar271 + fVar221 * fVar221;
        auVar121._4_4_ = fVar204 * fVar204 + fVar284 * fVar284 + fVar222 * fVar222;
        auVar121._8_4_ = fVar211 * fVar211 + fVar287 * fVar287 + fVar223 * fVar223;
        auVar121._12_4_ = fVar220 * fVar220 + fVar290 * fVar290 + fVar227 * fVar227;
        fVar246 = (auVar105._0_4_ - fVar60) * fVar114 + fVar60;
        fVar248 = (auVar105._4_4_ - fVar60) * fVar126 + fVar60;
        fVar251 = (auVar105._8_4_ - fVar60) * fVar127 + fVar60;
        fVar252 = (auVar105._12_4_ - fVar60) * fVar128 + fVar60;
        auVar163._0_4_ = fVar246 * fVar246 + auVar121._0_4_;
        auVar163._4_4_ = fVar248 * fVar248 + auVar121._4_4_;
        auVar163._8_4_ = fVar251 * fVar251 + auVar121._8_4_;
        auVar163._12_4_ = fVar252 * fVar252 + auVar121._12_4_;
        auVar231 = rsqrtps(auVar121,auVar163);
        fVar101 = auVar231._0_4_;
        fVar102 = auVar231._4_4_;
        fVar160 = auVar231._8_4_;
        fVar190 = auVar231._12_4_;
        fVar101 = fVar101 * 1.5 - fVar101 * fVar101 * auVar163._0_4_ * 0.5 * fVar101;
        fVar102 = fVar102 * 1.5 - fVar102 * fVar102 * auVar163._4_4_ * 0.5 * fVar102;
        fVar160 = fVar160 * 1.5 - fVar160 * fVar160 * auVar163._8_4_ * 0.5 * fVar160;
        fVar190 = fVar190 * 1.5 - fVar190 * fVar190 * auVar163._12_4_ * 0.5 * fVar190;
        auVar216._0_4_ = fVar221 * fVar101;
        auVar216._4_4_ = fVar222 * fVar102;
        auVar216._8_4_ = fVar223 * fVar160;
        auVar216._12_4_ = fVar227 * fVar190;
        auVar39._4_4_ = -(uint)(0.9995 < fVar230);
        auVar39._0_4_ = -(uint)(0.9995 < fVar228);
        auVar39._8_4_ = -(uint)(0.9995 < fVar235);
        auVar39._12_4_ = -(uint)(0.9995 < fVar237);
        auVar231 = blendvps(auVar72,auVar216,auVar39);
        auVar217._0_4_ = fVar203 * fVar253 - fVar112 * fVar229 * fVar191;
        auVar217._4_4_ = fVar203 * fVar256 - fVar113 * fVar234 * fVar192;
        auVar217._8_4_ = fVar203 * fVar265 - fVar57 * fVar236 * fVar193;
        auVar217._12_4_ = fVar203 * fVar268 - fVar77 * fVar245 * fVar201;
        auVar279._0_4_ = fVar271 * fVar101;
        auVar279._4_4_ = fVar284 * fVar102;
        auVar279._8_4_ = fVar287 * fVar160;
        auVar279._12_4_ = fVar290 * fVar190;
        auVar116 = blendvps(auVar217,auVar279,auVar39);
        auVar232._0_4_ = fVar51 * fVar253 - fVar78 * fVar229 * fVar191;
        auVar232._4_4_ = fVar51 * fVar256 - fVar79 * fVar234 * fVar192;
        auVar232._8_4_ = fVar51 * fVar265 - fVar80 * fVar236 * fVar193;
        auVar232._12_4_ = fVar51 * fVar268 - fVar100 * fVar245 * fVar201;
        auVar225._0_4_ = fVar202 * fVar101;
        auVar225._4_4_ = fVar204 * fVar102;
        auVar225._8_4_ = fVar211 * fVar160;
        auVar225._12_4_ = fVar220 * fVar190;
        auVar83 = blendvps(auVar232,auVar225,auVar39);
        auVar261._0_4_ = fVar253 * fVar60 - fVar229 * local_68 * fVar191;
        auVar261._4_4_ = fVar256 * fVar60 - fVar234 * fStack_64 * fVar192;
        auVar261._8_4_ = fVar265 * fVar60 - fVar236 * fStack_60 * fVar193;
        auVar261._12_4_ = fVar268 * fVar60 - fVar245 * fStack_5c * fVar201;
        local_1e8._0_4_ = SUB124(*(undefined1 (*) [12])&(pAVar13->l).vx.field_0,0);
        auVar207._0_4_ = fVar101 * fVar246;
        auVar207._4_4_ = fVar102 * fVar248;
        auVar207._8_4_ = fVar160 * fVar251;
        auVar207._12_4_ = fVar190 * fVar252;
        auVar130 = blendvps(auVar261,auVar207,auVar39);
        local_138 = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,0);
        fVar113 = 1.0 - fVar114;
        fVar51 = 1.0 - fVar126;
        fVar57 = 1.0 - fVar127;
        fVar60 = 1.0 - fVar128;
        fVar203 = (float)local_1e8._0_4_ * fVar57;
        fVar112 = (float)local_1e8._0_4_ * fVar60;
        local_1e8._4_4_ = (float)local_1e8._0_4_ * fVar51 + local_138 * fVar126;
        local_1e8._0_4_ = (float)local_1e8._0_4_ * fVar113 + local_138 * fVar114;
        fStack_1e0 = fVar203 + local_138 * fVar127;
        fStack_1dc = fVar112 + local_138 * fVar128;
        local_d8._4_4_ = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,4);
        local_228._4_4_ = fVar103 * fVar51 + (float)local_d8._4_4_ * fVar126;
        local_228._0_4_ = fVar103 * fVar113 + (float)local_d8._4_4_ * fVar114;
        uStack_220._0_4_ = fVar103 * fVar57 + (float)local_d8._4_4_ * fVar127;
        uStack_220._4_4_ = fVar103 * fVar60 + (float)local_d8._4_4_ * fVar128;
        fStack_c0 = SUB124(*(undefined1 (*) [12])&(pAVar11->l).vx.field_0,8);
        local_218._4_4_ = fVar111 * fVar51 + fStack_c0 * fVar126;
        local_218._0_4_ = fVar111 * fVar113 + fStack_c0 * fVar114;
        uStack_210._0_4_ = fVar111 * fVar57 + fStack_c0 * fVar127;
        uStack_210._4_4_ = fVar111 * fVar60 + fStack_c0 * fVar128;
        local_188._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar4->field_0,0);
        local_128 = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,0);
        fVar103 = (float)local_188._0_4_ * fVar57;
        fVar111 = (float)local_188._0_4_ * fVar60;
        local_188._4_4_ = (float)local_188._0_4_ * fVar51 + local_128 * fVar126;
        local_188._0_4_ = (float)local_188._0_4_ * fVar113 + local_128 * fVar114;
        fStack_180 = fVar103 + local_128 * fVar127;
        fStack_17c = fVar111 + local_128 * fVar128;
        fStack_114 = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,4);
        local_248._4_4_ = fVar247 * fVar51 + fStack_114 * fVar126;
        local_248._0_4_ = fVar247 * fVar113 + fStack_114 * fVar114;
        uStack_240._0_4_ = fVar247 * fVar57 + fStack_114 * fVar127;
        uStack_240._4_4_ = fVar247 * fVar60 + fStack_114 * fVar128;
        fStack_140 = SUB124(*(undefined1 (*) [12])&pVVar5->field_0,8);
        local_238._4_4_ = fVar29 * fVar51 + fStack_140 * fVar126;
        local_238._0_4_ = fVar29 * fVar113 + fStack_140 * fVar114;
        uStack_230._0_4_ = fVar29 * fVar57 + fStack_140 * fVar127;
        uStack_230._4_4_ = fVar29 * fVar60 + fStack_140 * fVar128;
        local_208._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar6->field_0,0);
        local_108 = SUB124(*(undefined1 (*) [12])&pVVar7->field_0,0);
        fVar103 = (float)local_208._0_4_ * fVar57;
        fVar111 = (float)local_208._0_4_ * fVar60;
        local_208._4_4_ = (float)local_208._0_4_ * fVar51 + local_108 * fVar126;
        local_208._0_4_ = (float)local_208._0_4_ * fVar113 + local_108 * fVar114;
        uStack_200._0_4_ = fVar103 + local_108 * fVar127;
        uStack_200._4_4_ = fVar111 + local_108 * fVar128;
        local_f8._4_4_ = SUB124(*(undefined1 (*) [12])&pVVar7->field_0,4);
        local_1a8._4_4_ = fVar272 * fVar51 + (float)local_f8._4_4_ * fVar126;
        local_1a8._0_4_ = fVar272 * fVar113 + (float)local_f8._4_4_ * fVar114;
        fStack_1a0 = fVar272 * fVar57 + (float)local_f8._4_4_ * fVar127;
        fStack_19c = fVar272 * fVar60 + (float)local_f8._4_4_ * fVar128;
        fStack_e0 = SUB124(*(undefined1 (*) [12])&pVVar7->field_0,8);
        local_1b8._4_4_ = fVar54 * fVar51 + fStack_e0 * fVar126;
        local_1b8._0_4_ = fVar54 * fVar113 + fStack_e0 * fVar114;
        fStack_1b0 = fVar54 * fVar57 + fStack_e0 * fVar127;
        fStack_1ac = fVar54 * fVar60 + fStack_e0 * fVar128;
        local_168._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,0);
        local_a8._4_4_ = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,4);
        fStack_b0 = SUB124(*(undefined1 (*) [12])&pVVar3->field_0,8);
        local_178._0_4_ = SUB124(*(undefined1 (*) [12])&pVVar2->field_0,0);
        fVar103 = (float)local_178._0_4_ * fVar57;
        fVar111 = (float)local_178._0_4_ * fVar60;
        local_178._4_4_ = (float)local_178._0_4_ * fVar51 + (float)local_168._0_4_ * fVar126;
        local_178._0_4_ = (float)local_178._0_4_ * fVar113 + (float)local_168._0_4_ * fVar114;
        fStack_170 = fVar103 + (float)local_168._0_4_ * fVar127;
        fStack_16c = fVar111 + (float)local_168._0_4_ * fVar128;
        local_198._4_4_ = fVar205 * fVar51 + (float)local_a8._4_4_ * fVar126;
        local_198._0_4_ = fVar205 * fVar113 + (float)local_a8._4_4_ * fVar114;
        fStack_190 = fVar205 * fVar57 + (float)local_a8._4_4_ * fVar127;
        fStack_18c = fVar205 * fVar60 + (float)local_a8._4_4_ * fVar128;
        local_1d8._4_4_ = fVar51 * fVar212 + fStack_b0 * fVar126;
        local_1d8._0_4_ = fVar113 * fVar212 + fStack_b0 * fVar114;
        fStack_1d0 = fVar57 * fVar212 + fStack_b0 * fVar127;
        fStack_1cc = fVar60 * fVar212 + fStack_b0 * fVar128;
        fVar114 = auVar130._0_4_;
        fVar127 = auVar130._4_4_;
        fVar103 = auVar130._8_4_;
        fVar203 = auVar130._12_4_;
        fVar60 = auVar116._0_4_;
        fVar78 = auVar116._4_4_;
        fVar80 = auVar116._8_4_;
        fVar101 = auVar116._12_4_;
        fVar236 = auVar83._0_4_;
        fVar237 = auVar83._4_4_;
        fVar245 = auVar83._8_4_;
        fVar246 = auVar83._12_4_;
        fVar126 = auVar231._0_4_;
        fVar128 = auVar231._4_4_;
        fVar111 = auVar231._8_4_;
        fVar205 = auVar231._12_4_;
        fVar29 = fVar60 * fVar236 + fVar126 * fVar114;
        fVar51 = fVar78 * fVar237 + fVar128 * fVar127;
        fVar57 = fVar80 * fVar245 + fVar111 * fVar103;
        fVar272 = fVar101 * fVar246 + fVar205 * fVar203;
        fVar204 = fVar60 * fVar236 - fVar126 * fVar114;
        fVar211 = fVar78 * fVar237 - fVar128 * fVar127;
        fVar220 = fVar80 * fVar245 - fVar111 * fVar103;
        fVar221 = fVar101 * fVar246 - fVar205 * fVar203;
        fVar212 = fVar126 * fVar126 - fVar60 * fVar60;
        fVar112 = fVar128 * fVar128 - fVar78 * fVar78;
        fVar113 = fVar111 * fVar111 - fVar80 * fVar80;
        fVar247 = fVar205 * fVar205 - fVar101 * fVar101;
        fVar102 = fVar60 * fVar114 - fVar126 * fVar236;
        fVar160 = fVar78 * fVar127 - fVar128 * fVar237;
        fVar190 = fVar80 * fVar103 - fVar111 * fVar245;
        fVar191 = fVar101 * fVar203 - fVar205 * fVar246;
        fVar222 = fVar126 * fVar236 + fVar60 * fVar114;
        fVar223 = fVar128 * fVar237 + fVar78 * fVar127;
        fVar227 = fVar111 * fVar245 + fVar80 * fVar103;
        fVar228 = fVar205 * fVar246 + fVar101 * fVar203;
        fVar192 = fVar114 * fVar236 + fVar60 * fVar126;
        fVar193 = fVar127 * fVar237 + fVar78 * fVar128;
        fVar201 = fVar103 * fVar245 + fVar80 * fVar111;
        fVar202 = fVar203 * fVar246 + fVar101 * fVar205;
        fVar54 = fVar114 * fVar236 - fVar60 * fVar126;
        fVar77 = fVar127 * fVar237 - fVar78 * fVar128;
        fVar79 = fVar103 * fVar245 - fVar80 * fVar111;
        fVar100 = fVar203 * fVar246 - fVar101 * fVar205;
        fVar236 = fVar236 * fVar236;
        fVar237 = fVar237 * fVar237;
        fVar245 = fVar245 * fVar245;
        fVar246 = fVar246 * fVar246;
        fVar114 = fVar114 * fVar114;
        fVar127 = fVar127 * fVar127;
        fVar103 = fVar103 * fVar103;
        fVar203 = fVar203 * fVar203;
        fVar229 = ((fVar126 * fVar126 + fVar60 * fVar60) - fVar236) - fVar114;
        fVar230 = ((fVar128 * fVar128 + fVar78 * fVar78) - fVar237) - fVar127;
        fVar234 = ((fVar111 * fVar111 + fVar80 * fVar80) - fVar245) - fVar103;
        fVar235 = ((fVar205 * fVar205 + fVar101 * fVar101) - fVar246) - fVar203;
        fVar126 = (fVar236 + fVar212) - fVar114;
        fVar128 = (fVar237 + fVar112) - fVar127;
        fVar111 = (fVar245 + fVar113) - fVar103;
        fVar205 = (fVar246 + fVar247) - fVar203;
        fVar114 = (fVar212 - fVar236) + fVar114;
        fVar127 = (fVar112 - fVar237) + fVar127;
        fVar103 = (fVar113 - fVar245) + fVar103;
        fVar203 = (fVar247 - fVar246) + fVar203;
        fStack_54 = local_58;
        fStack_50 = local_58;
        fStack_4c = local_58;
      }
      else {
        pAVar13 = pIVar9->local2world;
        auVar83 = auVar231;
        do {
          lVar14 = 0;
          if ((uVar27 & 0xf) != 0) {
            for (; ((uVar27 & 0xf) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          iVar8 = *(int *)((long)&local_98 + (long)(int)lVar14 * 4);
          auVar41._0_4_ = -(uint)(iVar8 == iVar275);
          auVar41._4_4_ = -(uint)(iVar8 == iVar283);
          auVar41._8_4_ = -(uint)(iVar8 == iVar286);
          auVar41._12_4_ = -(uint)(iVar8 == iVar289);
          auVar41 = auVar41 & auVar231;
          pAVar11 = pAVar13 + iVar8;
          uVar15 = *(undefined4 *)&(pAVar11->l).vx.field_0;
          uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
          uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
          uVar18 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 0xc);
          auVar164._4_4_ = uVar15;
          auVar164._0_4_ = uVar15;
          auVar164._8_4_ = uVar15;
          auVar164._12_4_ = uVar15;
          _local_1e8 = blendvps(_local_1e8,auVar164,auVar41);
          auVar165._4_4_ = uVar16;
          auVar165._0_4_ = uVar16;
          auVar165._8_4_ = uVar16;
          auVar165._12_4_ = uVar16;
          _local_228 = blendvps(_local_228,auVar165,auVar41);
          auVar166._4_4_ = uVar17;
          auVar166._0_4_ = uVar17;
          auVar166._8_4_ = uVar17;
          auVar166._12_4_ = uVar17;
          _local_218 = blendvps(_local_218,auVar166,auVar41);
          auVar145._4_4_ = uVar18;
          auVar145._0_4_ = uVar18;
          auVar145._8_4_ = uVar18;
          auVar145._12_4_ = uVar18;
          in_XMM12 = blendvps(in_XMM12,auVar145,auVar41);
          pVVar2 = &pAVar13[iVar8].l.vy;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar167._4_4_ = uVar15;
          auVar167._0_4_ = uVar15;
          auVar167._8_4_ = uVar15;
          auVar167._12_4_ = uVar15;
          _local_188 = blendvps(_local_188,auVar167,auVar41);
          auVar168._4_4_ = uVar16;
          auVar168._0_4_ = uVar16;
          auVar168._8_4_ = uVar16;
          auVar168._12_4_ = uVar16;
          _local_248 = blendvps(_local_248,auVar168,auVar41);
          auVar169._4_4_ = uVar17;
          auVar169._0_4_ = uVar17;
          auVar169._8_4_ = uVar17;
          auVar169._12_4_ = uVar17;
          _local_238 = blendvps(_local_238,auVar169,auVar41);
          auVar146._4_4_ = uVar18;
          auVar146._0_4_ = uVar18;
          auVar146._8_4_ = uVar18;
          auVar146._12_4_ = uVar18;
          auVar83 = blendvps(auVar83,auVar146,auVar41);
          pVVar2 = &pAVar13[iVar8].l.vz;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar170._4_4_ = uVar15;
          auVar170._0_4_ = uVar15;
          auVar170._8_4_ = uVar15;
          auVar170._12_4_ = uVar15;
          _local_208 = blendvps(_local_208,auVar170,auVar41);
          auVar171._4_4_ = uVar16;
          auVar171._0_4_ = uVar16;
          auVar171._8_4_ = uVar16;
          auVar171._12_4_ = uVar16;
          _local_1a8 = blendvps(_local_1a8,auVar171,auVar41);
          auVar172._4_4_ = uVar17;
          auVar172._0_4_ = uVar17;
          auVar172._8_4_ = uVar17;
          auVar172._12_4_ = uVar17;
          _local_1b8 = blendvps(_local_1b8,auVar172,auVar41);
          auVar147._4_4_ = uVar18;
          auVar147._0_4_ = uVar18;
          auVar147._8_4_ = uVar18;
          auVar147._12_4_ = uVar18;
          auVar105 = blendvps(auVar105,auVar147,auVar41);
          pVVar2 = &pAVar13[iVar8].p;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar173._4_4_ = uVar15;
          auVar173._0_4_ = uVar15;
          auVar173._8_4_ = uVar15;
          auVar173._12_4_ = uVar15;
          _local_178 = blendvps(_local_178,auVar173,auVar41);
          auVar174._4_4_ = uVar16;
          auVar174._0_4_ = uVar16;
          auVar174._8_4_ = uVar16;
          auVar174._12_4_ = uVar16;
          _local_198 = blendvps(_local_198,auVar174,auVar41);
          auVar175._4_4_ = uVar17;
          auVar175._0_4_ = uVar17;
          auVar175._8_4_ = uVar17;
          auVar175._12_4_ = uVar17;
          _local_258 = blendvps(_local_258,auVar175,auVar41);
          auVar148._4_4_ = uVar18;
          auVar148._0_4_ = uVar18;
          auVar148._8_4_ = uVar18;
          auVar148._12_4_ = uVar18;
          auVar116 = blendvps(auVar116,auVar148,auVar41);
          pAVar11 = pAVar13 + (long)iVar8 + 1;
          uVar15 = *(undefined4 *)&(pAVar11->l).vx.field_0;
          uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
          uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
          uVar18 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 0xc);
          auVar176._4_4_ = uVar15;
          auVar176._0_4_ = uVar15;
          auVar176._8_4_ = uVar15;
          auVar176._12_4_ = uVar15;
          in_XMM13 = blendvps(in_XMM13,auVar176,auVar41);
          auVar177._4_4_ = uVar16;
          auVar177._0_4_ = uVar16;
          auVar177._8_4_ = uVar16;
          auVar177._12_4_ = uVar16;
          in_XMM10 = blendvps(in_XMM10,auVar177,auVar41);
          auVar178._4_4_ = uVar17;
          auVar178._0_4_ = uVar17;
          auVar178._8_4_ = uVar17;
          auVar178._12_4_ = uVar17;
          _local_f8 = blendvps(_local_f8,auVar178,auVar41);
          auVar149._4_4_ = uVar18;
          auVar149._0_4_ = uVar18;
          auVar149._8_4_ = uVar18;
          auVar149._12_4_ = uVar18;
          auVar119 = blendvps(auVar119,auVar149,auVar41);
          pVVar2 = &pAVar13[(long)iVar8 + 1].l.vy;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar179._4_4_ = uVar15;
          auVar179._0_4_ = uVar15;
          auVar179._8_4_ = uVar15;
          auVar179._12_4_ = uVar15;
          _local_e8 = blendvps(_local_e8,auVar179,auVar41);
          auVar180._4_4_ = uVar16;
          auVar180._0_4_ = uVar16;
          auVar180._8_4_ = uVar16;
          auVar180._12_4_ = uVar16;
          _local_d8 = blendvps(_local_d8,auVar180,auVar41);
          auVar181._4_4_ = uVar17;
          auVar181._0_4_ = uVar17;
          auVar181._8_4_ = uVar17;
          auVar181._12_4_ = uVar17;
          _local_c8 = blendvps(_local_c8,auVar181,auVar41);
          auVar150._4_4_ = uVar18;
          auVar150._0_4_ = uVar18;
          auVar150._8_4_ = uVar18;
          auVar150._12_4_ = uVar18;
          in_XMM9 = blendvps(in_XMM9,auVar150,auVar41);
          pVVar2 = &pAVar13[(long)iVar8 + 1].l.vz;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar182._4_4_ = uVar15;
          auVar182._0_4_ = uVar15;
          auVar182._8_4_ = uVar15;
          auVar182._12_4_ = uVar15;
          _local_b8 = blendvps(_local_b8,auVar182,auVar41);
          auVar183._4_4_ = uVar16;
          auVar183._0_4_ = uVar16;
          auVar183._8_4_ = uVar16;
          auVar183._12_4_ = uVar16;
          _local_a8 = blendvps(_local_a8,auVar183,auVar41);
          auVar184._4_4_ = uVar17;
          auVar184._0_4_ = uVar17;
          auVar184._8_4_ = uVar17;
          auVar184._12_4_ = uVar17;
          _local_168 = blendvps(_local_168,auVar184,auVar41);
          auVar151._4_4_ = uVar18;
          auVar151._0_4_ = uVar18;
          auVar151._8_4_ = uVar18;
          auVar151._12_4_ = uVar18;
          in_XMM15 = blendvps(in_XMM15,auVar151,auVar41);
          pVVar2 = &pAVar13[(long)iVar8 + 1].p;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 0xc);
          auVar185._4_4_ = uVar15;
          auVar185._0_4_ = uVar15;
          auVar185._8_4_ = uVar15;
          auVar185._12_4_ = uVar15;
          _local_158 = blendvps(_local_158,auVar185,auVar41);
          auVar186._4_4_ = uVar16;
          auVar186._0_4_ = uVar16;
          auVar186._8_4_ = uVar16;
          auVar186._12_4_ = uVar16;
          _local_1d8 = blendvps(_local_1d8,auVar186,auVar41);
          auVar187._4_4_ = uVar17;
          auVar187._0_4_ = uVar17;
          auVar187._8_4_ = uVar17;
          auVar187._12_4_ = uVar17;
          _local_1f8 = blendvps(_local_1f8,auVar187,auVar41);
          auVar152._4_4_ = uVar18;
          auVar152._0_4_ = uVar18;
          auVar152._8_4_ = uVar18;
          auVar152._12_4_ = uVar18;
          in_XMM4 = blendvps(in_XMM4,auVar152,auVar41);
          auVar231 = auVar231 ^ auVar41;
          uVar27 = movmskps(iVar8 * 0x40,auVar231);
        } while (uVar27 != 0);
        fVar205 = auVar116._0_4_;
        fVar112 = auVar116._4_4_;
        fVar247 = auVar116._8_4_;
        fVar51 = auVar116._12_4_;
        fVar248 = in_XMM12._0_4_;
        fVar252 = in_XMM12._4_4_;
        fVar256 = in_XMM12._8_4_;
        fVar268 = in_XMM12._12_4_;
        fVar229 = auVar83._0_4_;
        fVar234 = auVar83._4_4_;
        fVar236 = auVar83._8_4_;
        fVar245 = auVar83._12_4_;
        fVar272 = auVar105._0_4_;
        fVar60 = auVar105._4_4_;
        fVar78 = auVar105._8_4_;
        fVar80 = auVar105._12_4_;
        auVar188._0_4_ =
             in_XMM15._0_4_ * fVar272 +
             in_XMM9._0_4_ * fVar229 + auVar119._0_4_ * fVar248 + in_XMM4._0_4_ * fVar205;
        auVar188._4_4_ =
             in_XMM15._4_4_ * fVar60 +
             in_XMM9._4_4_ * fVar234 + auVar119._4_4_ * fVar252 + in_XMM4._4_4_ * fVar112;
        auVar188._8_4_ =
             in_XMM15._8_4_ * fVar78 +
             in_XMM9._8_4_ * fVar236 + auVar119._8_4_ * fVar256 + in_XMM4._8_4_ * fVar247;
        auVar188._12_4_ =
             in_XMM15._12_4_ * fVar80 +
             in_XMM9._12_4_ * fVar245 + auVar119._12_4_ * fVar268 + in_XMM4._12_4_ * fVar51;
        uVar19 = CONCAT44(auVar188._4_4_,auVar188._0_4_);
        auVar42._4_4_ = -(uint)(auVar188._4_4_ < -auVar188._4_4_);
        auVar42._0_4_ = -(uint)(auVar188._0_4_ < -auVar188._0_4_);
        auVar42._8_4_ = -(uint)(auVar188._8_4_ < -auVar188._8_4_);
        auVar42._12_4_ = -(uint)(auVar188._12_4_ < -auVar188._12_4_);
        auVar196._8_4_ = -auVar188._8_4_;
        auVar196._0_8_ = uVar19 ^ 0x8000000080000000;
        auVar196._12_4_ = -auVar188._12_4_;
        auVar153._0_8_ = in_XMM4._0_8_ ^ 0x8000000080000000;
        auVar153._8_4_ = -in_XMM4._8_4_;
        auVar153._12_4_ = -in_XMM4._12_4_;
        auVar116 = blendvps(in_XMM4,auVar153,auVar42);
        auVar154._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
        auVar154._8_4_ = -auVar119._8_4_;
        auVar154._12_4_ = -auVar119._12_4_;
        auVar231 = blendvps(auVar119,auVar154,auVar42);
        auVar155._0_8_ = in_XMM9._0_8_ ^ 0x8000000080000000;
        auVar155._8_4_ = -in_XMM9._8_4_;
        auVar155._12_4_ = -in_XMM9._12_4_;
        auVar130 = blendvps(in_XMM9,auVar155,auVar42);
        auVar156._0_8_ = in_XMM15._0_8_ ^ 0x8000000080000000;
        auVar156._8_4_ = -in_XMM15._8_4_;
        auVar156._12_4_ = -in_XMM15._12_4_;
        auVar119 = blendvps(in_XMM15,auVar156,auVar42);
        local_38 = maxps(auVar196,auVar188);
        fVar212 = ABS(auVar188._0_4_);
        fVar113 = ABS(auVar188._4_4_);
        uVar19 = CONCAT44(auVar188._4_4_,auVar188._0_4_);
        auVar189._0_8_ = uVar19 & 0x7fffffff7fffffff;
        auVar189._8_4_ = ABS(auVar188._8_4_);
        auVar189._12_4_ = ABS(auVar188._12_4_);
        auVar157._0_4_ = 1.0 - fVar212;
        auVar157._4_4_ = 1.0 - fVar113;
        auVar157._8_4_ = 1.0 - auVar189._8_4_;
        auVar157._12_4_ = 1.0 - auVar189._12_4_;
        auVar83 = sqrtps(auVar157,auVar157);
        auVar43._0_4_ =
             1.5707964 -
             auVar83._0_4_ *
             (((((fVar212 * -0.0043095737 + 0.0192803) * fVar212 + -0.04489909) * fVar212 +
               0.08785567) * fVar212 + -0.21450998) * fVar212 + 1.5707952);
        auVar43._4_4_ =
             1.5707964 -
             auVar83._4_4_ *
             (((((fVar113 * -0.0043095737 + 0.0192803) * fVar113 + -0.04489909) * fVar113 +
               0.08785567) * fVar113 + -0.21450998) * fVar113 + 1.5707952);
        auVar43._8_4_ =
             1.5707964 -
             auVar83._8_4_ *
             (((((auVar189._8_4_ * -0.0043095737 + 0.0192803) * auVar189._8_4_ + -0.04489909) *
                auVar189._8_4_ + 0.08785567) * auVar189._8_4_ + -0.21450998) * auVar189._8_4_ +
             1.5707952);
        auVar43._12_4_ =
             1.5707964 -
             auVar83._12_4_ *
             (((((auVar189._12_4_ * -0.0043095737 + 0.0192803) * auVar189._12_4_ + -0.04489909) *
                auVar189._12_4_ + 0.08785567) * auVar189._12_4_ + -0.21450998) * auVar189._12_4_ +
             1.5707952);
        auVar83 = maxps(ZEXT816(0),auVar43);
        fVar202 = local_38._12_4_;
        fVar103 = local_38._0_4_;
        fVar111 = local_38._4_4_;
        fVar203 = local_38._8_4_;
        auVar44._4_4_ = -(uint)(fVar111 < 0.0);
        auVar44._0_4_ = -(uint)(fVar103 < 0.0);
        auVar44._8_4_ = -(uint)(fVar203 < 0.0);
        auVar44._12_4_ = -(uint)(fVar202 < 0.0);
        auVar158._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
        auVar158._8_4_ = auVar83._8_4_ ^ 0x80000000;
        auVar158._12_4_ = auVar83._12_4_ ^ 0x80000000;
        auVar83 = blendvps(auVar83,auVar158,auVar44);
        auVar197._0_4_ = 1.5707964 - auVar83._0_4_;
        auVar197._4_4_ = 1.5707964 - auVar83._4_4_;
        auVar197._8_4_ = 1.5707964 - auVar83._8_4_;
        auVar197._12_4_ = 1.5707964 - auVar83._12_4_;
        auVar45._4_4_ = -(uint)(1.0 < fVar113);
        auVar45._0_4_ = -(uint)(1.0 < fVar212);
        auVar45._8_4_ = -(uint)(1.0 < auVar189._8_4_);
        auVar45._12_4_ = -(uint)(1.0 < auVar189._12_4_);
        auVar83 = blendvps(auVar197,_DAT_01f80c30,auVar45);
        fVar212 = auVar83._0_4_ * fVar114;
        fVar113 = auVar83._4_4_ * fVar126;
        fVar29 = auVar83._8_4_ * fVar127;
        fVar57 = auVar83._12_4_ * fVar128;
        auVar46._0_4_ = fVar212 * 0.63661975;
        auVar46._4_4_ = fVar113 * 0.63661975;
        auVar46._8_4_ = fVar29 * 0.63661975;
        auVar46._12_4_ = fVar57 * 0.63661975;
        auVar83 = roundps(auVar189,auVar46,1);
        uVar55 = (uint)auVar83._0_4_;
        uVar56 = (uint)auVar83._4_4_;
        uVar58 = (uint)auVar83._8_4_;
        uVar59 = (uint)auVar83._12_4_;
        fVar212 = fVar212 - auVar83._0_4_ * 1.5707964;
        fVar113 = fVar113 - auVar83._4_4_ * 1.5707964;
        fVar29 = fVar29 - auVar83._8_4_ * 1.5707964;
        fVar57 = fVar57 - auVar83._12_4_ * 1.5707964;
        uVar27 = uVar55 & 3;
        uVar30 = uVar56 & 3;
        uVar52 = uVar58 & 3;
        uVar53 = uVar59 & 3;
        auVar159._0_4_ = fVar212 * fVar212;
        auVar159._4_4_ = fVar113 * fVar113;
        auVar159._8_4_ = fVar29 * fVar29;
        auVar159._12_4_ = fVar57 * fVar57;
        uVar55 = uVar55 & 1;
        uVar56 = uVar56 & 1;
        uVar58 = uVar58 & 1;
        uVar59 = uVar59 & 1;
        auVar99._0_4_ = -(uint)(uVar55 == 0);
        auVar99._4_4_ = -(uint)(uVar56 == 0);
        auVar99._8_4_ = -(uint)(uVar58 == 0);
        auVar99._12_4_ = -(uint)(uVar59 == 0);
        auVar264._4_4_ = -uVar56;
        auVar264._0_4_ = -uVar55;
        auVar264._8_4_ = -uVar58;
        auVar264._12_4_ = -uVar59;
        auVar243._0_8_ =
             CONCAT44((((((auVar159._4_4_ * -2.5029328e-08 + 2.7600126e-06) * auVar159._4_4_ +
                         -0.00019842605) * auVar159._4_4_ + 0.008333348) * auVar159._4_4_ +
                       -0.16666667) * auVar159._4_4_ + 1.0) * fVar113,
                      (((((auVar159._0_4_ * -2.5029328e-08 + 2.7600126e-06) * auVar159._0_4_ +
                         -0.00019842605) * auVar159._0_4_ + 0.008333348) * auVar159._0_4_ +
                       -0.16666667) * auVar159._0_4_ + 1.0) * fVar212);
        auVar243._8_4_ =
             (((((auVar159._8_4_ * -2.5029328e-08 + 2.7600126e-06) * auVar159._8_4_ + -0.00019842605
                ) * auVar159._8_4_ + 0.008333348) * auVar159._8_4_ + -0.16666667) * auVar159._8_4_ +
             1.0) * fVar29;
        auVar243._12_4_ =
             (((((auVar159._12_4_ * -2.5029328e-08 + 2.7600126e-06) * auVar159._12_4_ +
                -0.00019842605) * auVar159._12_4_ + 0.008333348) * auVar159._12_4_ + -0.16666667) *
              auVar159._12_4_ + 1.0) * fVar57;
        auVar209._0_4_ =
             ((((auVar159._0_4_ * -2.5963018e-07 + 2.4756235e-05) * auVar159._0_4_ + -0.001388833) *
               auVar159._0_4_ + 0.04166664) * auVar159._0_4_ + -0.5) * auVar159._0_4_ + 1.0;
        auVar209._4_4_ =
             ((((auVar159._4_4_ * -2.5963018e-07 + 2.4756235e-05) * auVar159._4_4_ + -0.001388833) *
               auVar159._4_4_ + 0.04166664) * auVar159._4_4_ + -0.5) * auVar159._4_4_ + 1.0;
        auVar209._8_4_ =
             ((((auVar159._8_4_ * -2.5963018e-07 + 2.4756235e-05) * auVar159._8_4_ + -0.001388833) *
               auVar159._8_4_ + 0.04166664) * auVar159._8_4_ + -0.5) * auVar159._8_4_ + 1.0;
        auVar209._12_4_ =
             ((((auVar159._12_4_ * -2.5963018e-07 + 2.4756235e-05) * auVar159._12_4_ + -0.001388833)
               * auVar159._12_4_ + 0.04166664) * auVar159._12_4_ + -0.5) * auVar159._12_4_ + 1.0;
        auVar233._8_4_ = auVar243._8_4_;
        auVar233._0_8_ = auVar243._0_8_;
        auVar233._12_4_ = auVar243._12_4_;
        auVar83 = blendvps(auVar233,auVar209,auVar264);
        auVar105 = blendvps(auVar243,auVar209,auVar99);
        auVar47._0_4_ = -(uint)(1 < uVar27);
        auVar47._4_4_ = -(uint)(1 < uVar30);
        auVar47._8_4_ = -(uint)(1 < uVar52);
        auVar47._12_4_ = -(uint)(1 < uVar53);
        auVar210._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
        auVar210._8_4_ = auVar83._8_4_ ^ 0x80000000;
        auVar210._12_4_ = auVar83._12_4_ ^ 0x80000000;
        local_78 = blendvps(auVar83,auVar210,auVar47);
        uVar27 = uVar27 - 1;
        uVar30 = uVar30 - 1;
        uVar52 = uVar52 - 1;
        uVar53 = uVar53 - 1;
        auVar282._0_4_ = -(uint)(((uVar27 == 0) * uVar27 | (uint)(uVar27 != 0)) == uVar27);
        auVar282._4_4_ = -(uint)(((uVar30 == 0) * uVar30 | (uint)(uVar30 != 0)) == uVar30);
        auVar282._8_4_ = -(uint)(((uVar52 == 0) * uVar52 | (uint)(uVar52 != 0)) == uVar52);
        auVar282._12_4_ = -(uint)(((uVar53 == 0) * uVar53 | (uint)(uVar53 != 0)) == uVar53);
        auVar198._0_8_ = auVar105._0_8_ ^ 0x8000000080000000;
        auVar198._8_4_ = auVar105._8_4_ ^ 0x80000000;
        auVar198._12_4_ = auVar105._12_4_ ^ 0x80000000;
        auVar105 = blendvps(auVar105,auVar198,auVar282);
        fVar101 = fVar205 * fVar103 - auVar116._0_4_;
        fVar102 = fVar112 * fVar111 - auVar116._4_4_;
        fVar160 = fVar247 * fVar203 - auVar116._8_4_;
        fVar190 = fVar51 * fVar202 - auVar116._12_4_;
        fVar54 = fVar248 * fVar103 - auVar231._0_4_;
        fVar77 = fVar252 * fVar111 - auVar231._4_4_;
        fVar79 = fVar256 * fVar203 - auVar231._8_4_;
        fVar100 = fVar268 * fVar202 - auVar231._12_4_;
        local_68 = fVar229 * fVar103 - auVar130._0_4_;
        fStack_64 = fVar234 * fVar111 - auVar130._4_4_;
        fStack_60 = fVar236 * fVar203 - auVar130._8_4_;
        fStack_5c = fVar245 * fVar202 - auVar130._12_4_;
        local_128 = auVar119._0_4_;
        fStack_124 = auVar119._4_4_;
        fStack_120 = auVar119._8_4_;
        fStack_11c = auVar119._12_4_;
        local_58 = fVar272 * fVar103 - local_128;
        fStack_54 = fVar60 * fVar111 - fStack_124;
        fStack_50 = fVar78 * fVar203 - fStack_120;
        fStack_4c = fVar80 * fVar202 - fStack_11c;
        auVar199._0_4_ =
             local_58 * local_58 + local_68 * local_68 + fVar54 * fVar54 + fVar101 * fVar101;
        auVar199._4_4_ =
             fStack_54 * fStack_54 + fStack_64 * fStack_64 + fVar77 * fVar77 + fVar102 * fVar102;
        auVar199._8_4_ =
             fStack_50 * fStack_50 + fStack_60 * fStack_60 + fVar79 * fVar79 + fVar160 * fVar160;
        auVar199._12_4_ =
             fStack_4c * fStack_4c + fStack_5c * fStack_5c + fVar100 * fVar100 + fVar190 * fVar190;
        auVar83 = rsqrtps(auVar159,auVar199);
        fVar212 = auVar83._0_4_;
        fVar113 = auVar83._4_4_;
        fVar29 = auVar83._8_4_;
        fVar57 = auVar83._12_4_;
        fVar204 = fVar212 * 1.5 - fVar212 * fVar212 * auVar199._0_4_ * 0.5 * fVar212;
        fVar211 = fVar113 * 1.5 - fVar113 * fVar113 * auVar199._4_4_ * 0.5 * fVar113;
        fVar220 = fVar29 * 1.5 - fVar29 * fVar29 * auVar199._8_4_ * 0.5 * fVar29;
        fVar221 = fVar57 * 1.5 - fVar57 * fVar57 * auVar199._12_4_ * 0.5 * fVar57;
        fVar230 = local_78._0_4_;
        fVar235 = local_78._4_4_;
        fVar237 = local_78._8_4_;
        fVar246 = local_78._12_4_;
        fVar251 = auVar105._0_4_;
        fVar253 = auVar105._4_4_;
        fVar265 = auVar105._8_4_;
        fVar271 = auVar105._12_4_;
        local_148._4_4_ = fVar112 * fVar253 - fVar102 * fVar211 * fVar235;
        local_148._0_4_ = fVar205 * fVar251 - fVar101 * fVar204 * fVar230;
        fStack_140 = fVar247 * fVar265 - fVar160 * fVar220 * fVar237;
        fStack_13c = fVar51 * fVar271 - fVar190 * fVar221 * fVar246;
        fVar205 = (auVar116._0_4_ - fVar205) * fVar114 + fVar205;
        fVar112 = (auVar116._4_4_ - fVar112) * fVar126 + fVar112;
        fVar247 = (auVar116._8_4_ - fVar247) * fVar127 + fVar247;
        fVar51 = (auVar116._12_4_ - fVar51) * fVar128 + fVar51;
        fVar101 = (auVar231._0_4_ - fVar248) * fVar114 + fVar248;
        fVar102 = (auVar231._4_4_ - fVar252) * fVar126 + fVar252;
        fVar160 = (auVar231._8_4_ - fVar256) * fVar127 + fVar256;
        fVar190 = (auVar231._12_4_ - fVar268) * fVar128 + fVar268;
        fVar222 = (auVar130._0_4_ - fVar229) * fVar114 + fVar229;
        fVar223 = (auVar130._4_4_ - fVar234) * fVar126 + fVar234;
        fVar227 = (auVar130._8_4_ - fVar236) * fVar127 + fVar236;
        fVar228 = (auVar130._12_4_ - fVar245) * fVar128 + fVar245;
        auVar75._0_4_ = fVar222 * fVar222 + fVar101 * fVar101 + fVar205 * fVar205;
        auVar75._4_4_ = fVar223 * fVar223 + fVar102 * fVar102 + fVar112 * fVar112;
        auVar75._8_4_ = fVar227 * fVar227 + fVar160 * fVar160 + fVar247 * fVar247;
        auVar75._12_4_ = fVar228 * fVar228 + fVar190 * fVar190 + fVar51 * fVar51;
        fVar191 = (local_128 - fVar272) * fVar114 + fVar272;
        fVar192 = (fStack_124 - fVar60) * fVar126 + fVar60;
        fVar193 = (fStack_120 - fVar78) * fVar127 + fVar78;
        fVar201 = (fStack_11c - fVar80) * fVar128 + fVar80;
        auVar48._0_4_ = fVar191 * fVar191 + auVar75._0_4_;
        auVar48._4_4_ = fVar192 * fVar192 + auVar75._4_4_;
        auVar48._8_4_ = fVar193 * fVar193 + auVar75._8_4_;
        auVar48._12_4_ = fVar201 * fVar201 + auVar75._12_4_;
        auVar231 = rsqrtps(auVar75,auVar48);
        fVar212 = auVar231._0_4_;
        fVar113 = auVar231._4_4_;
        fVar29 = auVar231._8_4_;
        fVar57 = auVar231._12_4_;
        fVar212 = fVar212 * 1.5 - fVar212 * fVar212 * auVar48._0_4_ * 0.5 * fVar212;
        fVar113 = fVar113 * 1.5 - fVar113 * fVar113 * auVar48._4_4_ * 0.5 * fVar113;
        fVar29 = fVar29 * 1.5 - fVar29 * fVar29 * auVar48._8_4_ * 0.5 * fVar29;
        fVar57 = fVar57 * 1.5 - fVar57 * fVar57 * auVar48._12_4_ * 0.5 * fVar57;
        auVar124._0_4_ = fVar205 * fVar212;
        auVar124._4_4_ = fVar112 * fVar113;
        auVar124._8_4_ = fVar247 * fVar29;
        auVar124._12_4_ = fVar51 * fVar57;
        uVar259 = CONCAT44(-(uint)(0.9995 < fVar111),-(uint)(0.9995 < fVar103));
        auVar49._8_4_ = -(uint)(0.9995 < fVar203);
        auVar49._0_8_ = uVar259;
        auVar49._12_4_ = -(uint)(0.9995 < fVar202);
        auVar231 = blendvps(_local_148,auVar124,auVar49);
        auVar76._0_4_ = fVar248 * fVar251 - fVar54 * fVar204 * fVar230;
        auVar76._4_4_ = fVar252 * fVar253 - fVar77 * fVar211 * fVar235;
        auVar76._8_4_ = fVar256 * fVar265 - fVar79 * fVar220 * fVar237;
        auVar76._12_4_ = fVar268 * fVar271 - fVar100 * fVar221 * fVar246;
        auVar110._0_4_ = fVar101 * fVar212;
        auVar110._4_4_ = fVar102 * fVar113;
        auVar110._8_4_ = fVar160 * fVar29;
        auVar110._12_4_ = fVar190 * fVar57;
        auVar116 = blendvps(auVar76,auVar110,auVar49);
        auVar125._0_4_ = fVar229 * fVar251 - local_68 * fVar204 * fVar230;
        auVar125._4_4_ = fVar234 * fVar253 - fStack_64 * fVar211 * fVar235;
        auVar125._8_4_ = fVar236 * fVar265 - fStack_60 * fVar220 * fVar237;
        auVar125._12_4_ = fVar245 * fVar271 - fStack_5c * fVar221 * fVar246;
        auVar219._0_4_ = fVar222 * fVar212;
        auVar219._4_4_ = fVar223 * fVar113;
        auVar219._8_4_ = fVar227 * fVar29;
        auVar219._12_4_ = fVar228 * fVar57;
        auVar50._8_4_ = -(uint)(0.9995 < fVar203);
        auVar50._0_8_ = uVar259;
        auVar50._12_4_ = -(uint)(0.9995 < fVar202);
        auVar83 = blendvps(auVar125,auVar219,auVar50);
        auVar244._0_4_ = fVar251 * fVar272 - fVar204 * local_58 * fVar230;
        auVar244._4_4_ = fVar253 * fVar60 - fVar211 * fStack_54 * fVar235;
        auVar244._8_4_ = fVar265 * fVar78 - fVar220 * fStack_50 * fVar237;
        auVar244._12_4_ = fVar271 * fVar80 - fVar221 * fStack_4c * fVar246;
        auVar200._0_4_ = fVar212 * fVar191;
        auVar200._4_4_ = fVar113 * fVar192;
        auVar200._8_4_ = fVar29 * fVar193;
        auVar200._12_4_ = fVar57 * fVar201;
        auVar130 = blendvps(auVar244,auVar200,auVar50);
        fVar103 = 1.0 - fVar114;
        fVar111 = 1.0 - fVar126;
        fVar203 = 1.0 - fVar127;
        fVar205 = 1.0 - fVar128;
        local_1e8._4_4_ = (float)local_1e8._4_4_ * fVar111 + in_XMM13._4_4_ * fVar126;
        local_1e8._0_4_ = (float)local_1e8._0_4_ * fVar103 + in_XMM13._0_4_ * fVar114;
        fStack_1e0 = fStack_1e0 * fVar203 + in_XMM13._8_4_ * fVar127;
        fStack_1dc = fStack_1dc * fVar205 + in_XMM13._12_4_ * fVar128;
        local_228._4_4_ = (float)local_228._4_4_ * fVar111 + in_XMM10._4_4_ * fVar126;
        local_228._0_4_ = (float)local_228._0_4_ * fVar103 + in_XMM10._0_4_ * fVar114;
        uStack_220._0_4_ = (float)uStack_220 * fVar203 + in_XMM10._8_4_ * fVar127;
        uStack_220._4_4_ = uStack_220._4_4_ * fVar205 + in_XMM10._12_4_ * fVar128;
        local_218._4_4_ = (float)local_218._4_4_ * fVar111 + (float)local_f8._4_4_ * fVar126;
        local_218._0_4_ = (float)local_218._0_4_ * fVar103 + (float)local_f8._0_4_ * fVar114;
        uStack_210._0_4_ = (float)uStack_210 * fVar203 + fStack_f0 * fVar127;
        uStack_210._4_4_ = uStack_210._4_4_ * fVar205 + fStack_ec * fVar128;
        local_188._4_4_ = (float)local_188._4_4_ * fVar111 + (float)local_e8._4_4_ * fVar126;
        local_188._0_4_ = (float)local_188._0_4_ * fVar103 + (float)local_e8._0_4_ * fVar114;
        fStack_180 = fStack_180 * fVar203 + fStack_e0 * fVar127;
        fStack_17c = fStack_17c * fVar205 + fStack_dc * fVar128;
        local_248._4_4_ = (float)local_248._4_4_ * fVar111 + (float)local_d8._4_4_ * fVar126;
        local_248._0_4_ = (float)local_248._0_4_ * fVar103 + (float)local_d8._0_4_ * fVar114;
        uStack_240._0_4_ = (float)uStack_240 * fVar203 + fStack_d0 * fVar127;
        uStack_240._4_4_ = uStack_240._4_4_ * fVar205 + fStack_cc * fVar128;
        local_238._4_4_ = (float)local_238._4_4_ * fVar111 + (float)local_c8._4_4_ * fVar126;
        local_238._0_4_ = (float)local_238._0_4_ * fVar103 + (float)local_c8._0_4_ * fVar114;
        uStack_230._0_4_ = (float)uStack_230 * fVar203 + fStack_c0 * fVar127;
        uStack_230._4_4_ = uStack_230._4_4_ * fVar205 + fStack_bc * fVar128;
        local_208._4_4_ = (float)local_208._4_4_ * fVar111 + (float)local_b8._4_4_ * fVar126;
        local_208._0_4_ = (float)local_208._0_4_ * fVar103 + (float)local_b8._0_4_ * fVar114;
        uStack_200._0_4_ = (float)uStack_200 * fVar203 + fStack_b0 * fVar127;
        uStack_200._4_4_ = uStack_200._4_4_ * fVar205 + fStack_ac * fVar128;
        local_1a8._4_4_ = (float)local_1a8._4_4_ * fVar111 + (float)local_a8._4_4_ * fVar126;
        local_1a8._0_4_ = (float)local_1a8._0_4_ * fVar103 + (float)local_a8._0_4_ * fVar114;
        fStack_1a0 = fStack_1a0 * fVar203 + fStack_a0 * fVar127;
        fStack_19c = fStack_19c * fVar205 + fStack_9c * fVar128;
        local_1b8._4_4_ = (float)local_1b8._4_4_ * fVar111 + (float)local_168._4_4_ * fVar126;
        local_1b8._0_4_ = (float)local_1b8._0_4_ * fVar103 + (float)local_168._0_4_ * fVar114;
        fStack_1b0 = fStack_1b0 * fVar203 + fStack_160 * fVar127;
        fStack_1ac = fStack_1ac * fVar205 + fStack_15c * fVar128;
        local_178._4_4_ = (float)local_178._4_4_ * fVar111 + (float)local_158._4_4_ * fVar126;
        local_178._0_4_ = (float)local_178._0_4_ * fVar103 + (float)local_158._0_4_ * fVar114;
        fStack_170 = fStack_170 * fVar203 + fStack_150 * fVar127;
        fStack_16c = fStack_16c * fVar205 + fStack_14c * fVar128;
        local_198._4_4_ = (float)local_198._4_4_ * fVar111 + (float)local_1d8._4_4_ * fVar126;
        local_198._0_4_ = (float)local_198._0_4_ * fVar103 + (float)local_1d8._0_4_ * fVar114;
        fStack_190 = fStack_190 * fVar203 + fStack_1d0 * fVar127;
        fStack_18c = fStack_18c * fVar205 + fStack_1cc * fVar128;
        local_1d8._4_4_ = fVar111 * (float)local_258._4_4_ + (float)local_1f8._4_4_ * fVar126;
        local_1d8._0_4_ = fVar103 * (float)local_258._0_4_ + (float)local_1f8._0_4_ * fVar114;
        fStack_1d0 = fVar203 * (float)uStack_250 + fStack_1f0 * fVar127;
        fStack_1cc = fVar205 * uStack_250._4_4_ + fStack_1ec * fVar128;
        fVar126 = auVar116._0_4_;
        fVar128 = auVar116._4_4_;
        fVar205 = auVar116._12_4_;
        local_148._0_4_ = auVar231._0_4_;
        local_148._4_4_ = auVar231._4_4_;
        fStack_140 = auVar231._8_4_;
        fStack_13c = auVar231._12_4_;
        fVar111 = auVar116._8_4_;
        fVar54 = auVar83._0_4_;
        fVar77 = auVar83._4_4_;
        fVar79 = auVar83._8_4_;
        fVar100 = auVar83._12_4_;
        fVar114 = auVar130._0_4_;
        fVar127 = auVar130._4_4_;
        fVar103 = auVar130._8_4_;
        fVar203 = auVar130._12_4_;
        fVar29 = fVar126 * fVar54 + (float)local_148._0_4_ * fVar114;
        fVar51 = fVar128 * fVar77 + (float)local_148._4_4_ * fVar127;
        fVar57 = fVar111 * fVar79 + fStack_140 * fVar103;
        fVar272 = fVar205 * fVar100 + fStack_13c * fVar203;
        fVar204 = fVar126 * fVar54 - (float)local_148._0_4_ * fVar114;
        fVar211 = fVar128 * fVar77 - (float)local_148._4_4_ * fVar127;
        fVar220 = fVar111 * fVar79 - fStack_140 * fVar103;
        fVar221 = fVar205 * fVar100 - fStack_13c * fVar203;
        fVar60 = fVar54 * fVar54;
        fVar78 = fVar77 * fVar77;
        fVar80 = fVar79 * fVar79;
        fVar101 = fVar100 * fVar100;
        fVar212 = (float)local_148._0_4_ * (float)local_148._0_4_ - fVar126 * fVar126;
        fVar112 = (float)local_148._4_4_ * (float)local_148._4_4_ - fVar128 * fVar128;
        fVar113 = fStack_140 * fStack_140 - fVar111 * fVar111;
        fVar247 = fStack_13c * fStack_13c - fVar205 * fVar205;
        fVar102 = fVar126 * fVar114 - (float)local_148._0_4_ * fVar54;
        fVar160 = fVar128 * fVar127 - (float)local_148._4_4_ * fVar77;
        fVar190 = fVar111 * fVar103 - fStack_140 * fVar79;
        fVar191 = fVar205 * fVar203 - fStack_13c * fVar100;
        fVar222 = (float)local_148._0_4_ * fVar54 + fVar126 * fVar114;
        fVar223 = (float)local_148._4_4_ * fVar77 + fVar128 * fVar127;
        fVar227 = fStack_140 * fVar79 + fVar111 * fVar103;
        fVar228 = fStack_13c * fVar100 + fVar205 * fVar203;
        fVar192 = fVar114 * fVar54 + fVar126 * (float)local_148._0_4_;
        fVar193 = fVar127 * fVar77 + fVar128 * (float)local_148._4_4_;
        fVar201 = fVar103 * fVar79 + fVar111 * fStack_140;
        fVar202 = fVar203 * fVar100 + fVar205 * fStack_13c;
        fVar54 = fVar114 * fVar54 - fVar126 * (float)local_148._0_4_;
        fVar77 = fVar127 * fVar77 - fVar128 * (float)local_148._4_4_;
        fVar79 = fVar103 * fVar79 - fVar111 * fStack_140;
        fVar100 = fVar203 * fVar100 - fVar205 * fStack_13c;
        fVar114 = fVar114 * fVar114;
        fVar127 = fVar127 * fVar127;
        fVar103 = fVar103 * fVar103;
        fVar203 = fVar203 * fVar203;
        fVar229 = (((float)local_148._0_4_ * (float)local_148._0_4_ + fVar126 * fVar126) - fVar60) -
                  fVar114;
        fVar230 = (((float)local_148._4_4_ * (float)local_148._4_4_ + fVar128 * fVar128) - fVar78) -
                  fVar127;
        fVar234 = ((fStack_140 * fStack_140 + fVar111 * fVar111) - fVar80) - fVar103;
        fVar235 = ((fStack_13c * fStack_13c + fVar205 * fVar205) - fVar101) - fVar203;
        fVar126 = (fVar60 + fVar212) - fVar114;
        fVar128 = (fVar78 + fVar112) - fVar127;
        fVar111 = (fVar80 + fVar113) - fVar103;
        fVar205 = (fVar101 + fVar247) - fVar203;
        fVar114 = (fVar212 - fVar60) + fVar114;
        fVar127 = (fVar112 - fVar78) + fVar127;
        fVar103 = (fVar113 - fVar80) + fVar103;
        fVar203 = (fVar247 - fVar101) + fVar203;
      }
      fVar212 = (fVar102 + fVar102) * 0.0;
      fVar112 = (fVar160 + fVar160) * 0.0;
      fVar113 = (fVar190 + fVar190) * 0.0;
      fVar247 = (fVar191 + fVar191) * 0.0;
      fVar101 = (fVar29 + fVar29) * 0.0;
      fVar237 = (fVar51 + fVar51) * 0.0;
      fVar246 = (fVar57 + fVar57) * 0.0;
      fVar251 = (fVar272 + fVar272) * 0.0;
      fVar236 = fVar101 + fVar212 + fVar229;
      fVar245 = fVar237 + fVar112 + fVar230;
      fVar248 = fVar246 + fVar113 + fVar234;
      fVar252 = fVar251 + fVar247 + fVar235;
      fVar29 = fVar212 + fVar29 + fVar29 + fVar229 * 0.0;
      fVar60 = fVar112 + fVar51 + fVar51 + fVar230 * 0.0;
      fVar78 = fVar113 + fVar57 + fVar57 + fVar234 * 0.0;
      fVar80 = fVar247 + fVar272 + fVar272 + fVar235 * 0.0;
      fVar257 = fVar229 * 0.0 + fVar102 + fVar102 + fVar101;
      fVar266 = fVar230 * 0.0 + fVar160 + fVar160 + fVar237;
      fVar269 = fVar234 * 0.0 + fVar190 + fVar190 + fVar246;
      fVar273 = fVar235 * 0.0 + fVar191 + fVar191 + fVar251;
      fVar212 = (fVar192 + fVar192) * 0.0;
      fVar112 = (fVar193 + fVar193) * 0.0;
      fVar113 = (fVar201 + fVar201) * 0.0;
      fVar247 = (fVar202 + fVar202) * 0.0;
      fVar229 = fVar212 + fVar126 * 0.0 + fVar204 + fVar204;
      fVar230 = fVar112 + fVar128 * 0.0 + fVar211 + fVar211;
      fVar234 = fVar113 + fVar111 * 0.0 + fVar220 + fVar220;
      fVar235 = fVar247 + fVar205 * 0.0 + fVar221 + fVar221;
      fVar237 = (fVar204 + fVar204) * 0.0;
      fVar211 = (fVar211 + fVar211) * 0.0;
      fVar220 = (fVar220 + fVar220) * 0.0;
      fVar221 = (fVar221 + fVar221) * 0.0;
      fVar265 = fVar126 + fVar212 + fVar237;
      fVar271 = fVar128 + fVar112 + fVar211;
      fVar287 = fVar111 + fVar113 + fVar220;
      fVar254 = fVar205 + fVar247 + fVar221;
      fVar237 = fVar237 + fVar126 * 0.0 + fVar192 + fVar192;
      fVar211 = fVar211 + fVar128 * 0.0 + fVar193 + fVar193;
      fVar220 = fVar220 + fVar111 * 0.0 + fVar201 + fVar201;
      fVar221 = fVar221 + fVar205 * 0.0 + fVar202 + fVar202;
      fVar126 = (fVar54 + fVar54) * 0.0;
      fVar128 = (fVar77 + fVar77) * 0.0;
      fVar111 = (fVar79 + fVar79) * 0.0;
      fVar205 = (fVar100 + fVar100) * 0.0;
      fVar201 = fVar126 + fVar114 * 0.0 + fVar222 + fVar222;
      fVar285 = fVar128 + fVar127 * 0.0 + fVar223 + fVar223;
      fVar288 = fVar111 + fVar103 * 0.0 + fVar227 + fVar227;
      fVar291 = fVar205 + fVar203 * 0.0 + fVar228 + fVar228;
      fVar160 = (fVar222 + fVar222) * 0.0;
      fVar190 = (fVar223 + fVar223) * 0.0;
      fVar191 = (fVar227 + fVar227) * 0.0;
      fVar192 = (fVar228 + fVar228) * 0.0;
      fVar193 = fVar114 * 0.0 + fVar54 + fVar54 + fVar160;
      fVar77 = fVar127 * 0.0 + fVar77 + fVar77 + fVar190;
      fVar202 = fVar103 * 0.0 + fVar79 + fVar79 + fVar191;
      fVar204 = fVar203 * 0.0 + fVar100 + fVar100 + fVar192;
      fVar160 = fVar160 + fVar126 + fVar114;
      fVar190 = fVar190 + fVar128 + fVar127;
      fVar191 = fVar191 + fVar111 + fVar103;
      fVar192 = fVar192 + fVar205 + fVar203;
      fVar222 = (float)local_1e8._0_4_ * fVar236 + fVar229 * 0.0 + fVar201 * 0.0;
      fVar223 = (float)local_1e8._4_4_ * fVar245 + fVar230 * 0.0 + fVar285 * 0.0;
      fVar227 = fStack_1e0 * fVar248 + fVar234 * 0.0 + fVar288 * 0.0;
      fVar228 = fStack_1dc * fVar252 + fVar235 * 0.0 + fVar291 * 0.0;
      fVar246 = (float)local_1e8._0_4_ * fVar29 + fVar265 * 0.0 + fVar193 * 0.0;
      fVar251 = (float)local_1e8._4_4_ * fVar60 + fVar271 * 0.0 + fVar77 * 0.0;
      fVar253 = fStack_1e0 * fVar78 + fVar287 * 0.0 + fVar202 * 0.0;
      fVar256 = fStack_1dc * fVar80 + fVar254 * 0.0 + fVar204 * 0.0;
      fVar114 = (float)local_1e8._0_4_ * fVar257 + fVar237 * 0.0 + fVar160 * 0.0;
      fVar128 = (float)local_1e8._4_4_ * fVar266 + fVar211 * 0.0 + fVar190 * 0.0;
      fVar203 = fStack_1e0 * fVar269 + fVar220 * 0.0 + fVar191 * 0.0;
      fVar112 = fStack_1dc * fVar273 + fVar221 * 0.0 + fVar192 * 0.0;
      fVar126 = (float)local_188._0_4_ * fVar236 + (float)local_248._0_4_ * fVar229 + fVar201 * 0.0;
      fVar103 = (float)local_188._4_4_ * fVar245 + (float)local_248._4_4_ * fVar230 + fVar285 * 0.0;
      fVar205 = fStack_180 * fVar248 + (float)uStack_240 * fVar234 + fVar288 * 0.0;
      fVar113 = fStack_17c * fVar252 + uStack_240._4_4_ * fVar235 + fVar291 * 0.0;
      fVar127 = (float)local_188._0_4_ * fVar29 + (float)local_248._0_4_ * fVar265 + fVar193 * 0.0;
      fVar111 = (float)local_188._4_4_ * fVar60 + (float)local_248._4_4_ * fVar271 + fVar77 * 0.0;
      fVar212 = fStack_180 * fVar78 + (float)uStack_240 * fVar287 + fVar202 * 0.0;
      fVar247 = fStack_17c * fVar80 + uStack_240._4_4_ * fVar254 + fVar204 * 0.0;
      fVar258 = (float)local_188._0_4_ * fVar257 + (float)local_248._0_4_ * fVar237 + fVar160 * 0.0;
      fVar267 = (float)local_188._4_4_ * fVar266 + (float)local_248._4_4_ * fVar211 + fVar190 * 0.0;
      fVar270 = fStack_180 * fVar269 + (float)uStack_240 * fVar220 + fVar191 * 0.0;
      fVar274 = fStack_17c * fVar273 + uStack_240._4_4_ * fVar221 + fVar192 * 0.0;
      fVar51 = (float)local_208._0_4_ * fVar236 +
               (float)local_1a8._0_4_ * fVar229 + (float)local_1b8._0_4_ * fVar201;
      fVar57 = (float)local_208._4_4_ * fVar245 +
               (float)local_1a8._4_4_ * fVar230 + (float)local_1b8._4_4_ * fVar285;
      fVar272 = (float)uStack_200 * fVar248 + fStack_1a0 * fVar234 + fStack_1b0 * fVar288;
      fVar54 = uStack_200._4_4_ * fVar252 + fStack_19c * fVar235 + fStack_1ac * fVar291;
      fVar79 = (float)local_208._0_4_ * fVar29 +
               (float)local_1a8._0_4_ * fVar265 + (float)local_1b8._0_4_ * fVar193;
      fVar100 = (float)local_208._4_4_ * fVar60 +
                (float)local_1a8._4_4_ * fVar271 + (float)local_1b8._4_4_ * fVar77;
      fVar101 = (float)uStack_200 * fVar78 + fStack_1a0 * fVar287 + fStack_1b0 * fVar202;
      fVar102 = uStack_200._4_4_ * fVar80 + fStack_19c * fVar254 + fStack_1ac * fVar204;
      fVar268 = (float)local_208._0_4_ * fVar257 +
                (float)local_1a8._0_4_ * fVar237 + (float)local_1b8._0_4_ * fVar160;
      fVar284 = (float)local_208._4_4_ * fVar266 +
                (float)local_1a8._4_4_ * fVar211 + (float)local_1b8._4_4_ * fVar190;
      fVar290 = (float)uStack_200 * fVar269 + fStack_1a0 * fVar220 + fStack_1b0 * fVar191;
      fVar255 = uStack_200._4_4_ * fVar273 + fStack_19c * fVar221 + fStack_1ac * fVar192;
      fVar229 = fVar236 * (float)local_178._0_4_ +
                fVar229 * (float)local_198._0_4_ + fVar201 * (float)local_1d8._0_4_ +
                (float)local_228._0_4_ + 0.0;
      fVar230 = fVar245 * (float)local_178._4_4_ +
                fVar230 * (float)local_198._4_4_ + fVar285 * (float)local_1d8._4_4_ +
                (float)local_228._4_4_ + 0.0;
      fVar234 = fVar248 * fStack_170 + fVar234 * fStack_190 + fVar288 * fStack_1d0 +
                (float)uStack_220 + 0.0;
      fVar235 = fVar252 * fStack_16c + fVar235 * fStack_18c + fVar291 * fStack_1cc +
                uStack_220._4_4_ + 0.0;
      fVar193 = fVar29 * (float)local_178._0_4_ +
                fVar265 * (float)local_198._0_4_ + fVar193 * (float)local_1d8._0_4_ +
                (float)local_218._0_4_ + 0.0;
      fVar201 = fVar60 * (float)local_178._4_4_ +
                fVar271 * (float)local_198._4_4_ + fVar77 * (float)local_1d8._4_4_ +
                (float)local_218._4_4_ + 0.0;
      fVar202 = fVar78 * fStack_170 + fVar287 * fStack_190 + fVar202 * fStack_1d0 +
                (float)uStack_210 + 0.0;
      fVar80 = fVar80 * fStack_16c + fVar254 * fStack_18c + fVar204 * fStack_1cc +
               uStack_210._4_4_ + 0.0;
      fVar160 = fVar257 * (float)local_178._0_4_ +
                fVar237 * (float)local_198._0_4_ + fVar160 * (float)local_1d8._0_4_ +
                (float)local_238._0_4_ + 0.0;
      fVar190 = fVar266 * (float)local_178._4_4_ +
                fVar211 * (float)local_198._4_4_ + fVar190 * (float)local_1d8._4_4_ +
                (float)local_238._4_4_ + 0.0;
      fVar191 = fVar269 * fStack_170 + fVar220 * fStack_190 + fVar191 * fStack_1d0 +
                (float)uStack_230 + 0.0;
      fVar192 = fVar273 * fStack_16c + fVar221 * fStack_18c + fVar192 * fStack_1cc +
                uStack_230._4_4_ + 0.0;
      fVar29 = fVar127 * fVar268 - fVar258 * fVar79;
      fVar60 = fVar111 * fVar284 - fVar267 * fVar100;
      auVar262._4_4_ = fVar60;
      auVar262._0_4_ = fVar29;
      fVar77 = fVar212 * fVar290 - fVar270 * fVar101;
      fVar78 = fVar247 * fVar255 - fVar274 * fVar102;
      auVar122._0_4_ = fVar258 * fVar51 - fVar126 * fVar268;
      auVar122._4_4_ = fVar267 * fVar57 - fVar103 * fVar284;
      auVar122._8_4_ = fVar270 * fVar272 - fVar205 * fVar290;
      auVar122._12_4_ = fVar274 * fVar54 - fVar113 * fVar255;
      auVar208._0_4_ = fVar126 * fVar79 - fVar127 * fVar51;
      auVar208._4_4_ = fVar103 * fVar100 - fVar111 * fVar57;
      auVar208._8_4_ = fVar205 * fVar101 - fVar212 * fVar272;
      auVar208._12_4_ = fVar113 * fVar102 - fVar247 * fVar54;
      local_258._4_4_ = fVar100 * fVar128 - fVar284 * fVar251;
      local_258._0_4_ = fVar79 * fVar114 - fVar268 * fVar246;
      uStack_250._0_4_ = fVar101 * fVar203 - fVar290 * fVar253;
      uStack_250._4_4_ = fVar102 * fVar112 - fVar255 * fVar256;
      auVar250._0_4_ = fVar268 * fVar222 - fVar51 * fVar114;
      auVar250._4_4_ = fVar284 * fVar223 - fVar57 * fVar128;
      auVar250._8_4_ = fVar290 * fVar227 - fVar272 * fVar203;
      auVar250._12_4_ = fVar255 * fVar228 - fVar54 * fVar112;
      auVar73._0_4_ = fVar51 * fVar246 - fVar79 * fVar222;
      auVar73._4_4_ = fVar57 * fVar251 - fVar100 * fVar223;
      auVar73._8_4_ = fVar272 * fVar253 - fVar101 * fVar227;
      auVar73._12_4_ = fVar54 * fVar256 - fVar102 * fVar228;
      auVar280._0_4_ = fVar246 * fVar258 - fVar114 * fVar127;
      auVar280._4_4_ = fVar251 * fVar267 - fVar128 * fVar111;
      auVar280._8_4_ = fVar253 * fVar270 - fVar203 * fVar212;
      auVar280._12_4_ = fVar256 * fVar274 - fVar112 * fVar247;
      auVar241._0_4_ = fVar114 * fVar126 - fVar258 * fVar222;
      auVar241._4_4_ = fVar128 * fVar103 - fVar267 * fVar223;
      auVar241._8_4_ = fVar203 * fVar205 - fVar270 * fVar227;
      auVar241._12_4_ = fVar112 * fVar113 - fVar274 * fVar228;
      auVar262._8_4_ = fVar77;
      auVar262._12_4_ = fVar78;
      auVar85._0_4_ = fVar127 * fVar222 - fVar126 * fVar246;
      auVar85._4_4_ = fVar111 * fVar223 - fVar103 * fVar251;
      auVar85._8_4_ = fVar212 * fVar227 - fVar205 * fVar253;
      auVar85._12_4_ = fVar247 * fVar228 - fVar113 * fVar256;
      auVar218._0_4_ = fVar222 * fVar29 + fVar246 * auVar122._0_4_ + fVar114 * auVar208._0_4_;
      auVar218._4_4_ = fVar223 * fVar60 + fVar251 * auVar122._4_4_ + fVar128 * auVar208._4_4_;
      auVar218._8_4_ = fVar227 * fVar77 + fVar253 * auVar122._8_4_ + fVar203 * auVar208._8_4_;
      auVar218._12_4_ = fVar228 * fVar78 + fVar256 * auVar122._12_4_ + fVar112 * auVar208._12_4_;
      auVar231 = divps(auVar262,auVar218);
      auVar83 = divps(_local_258,auVar218);
      auVar277 = divps(auVar280,auVar218);
      auVar119 = divps(auVar122,auVar218);
      auVar105 = divps(auVar250,auVar218);
      auVar239 = divps(auVar241,auVar218);
      auVar214 = divps(auVar208,auVar218);
      auVar116 = divps(auVar73,auVar218);
      auVar130 = divps(auVar85,auVar218);
      fVar103 = fVar229 * auVar231._0_4_ + fVar193 * auVar119._0_4_ + fVar160 * auVar214._0_4_;
      fVar111 = fVar230 * auVar231._4_4_ + fVar201 * auVar119._4_4_ + fVar190 * auVar214._4_4_;
      fVar203 = fVar234 * auVar231._8_4_ + fVar202 * auVar119._8_4_ + fVar191 * auVar214._8_4_;
      fVar205 = fVar235 * auVar231._12_4_ + fVar80 * auVar119._12_4_ + fVar192 * auVar214._12_4_;
      fVar212 = fVar229 * auVar83._0_4_ + fVar193 * auVar105._0_4_ + fVar160 * auVar116._0_4_;
      fVar112 = fVar230 * auVar83._4_4_ + fVar201 * auVar105._4_4_ + fVar190 * auVar116._4_4_;
      fVar113 = fVar234 * auVar83._8_4_ + fVar202 * auVar105._8_4_ + fVar191 * auVar116._8_4_;
      fVar247 = fVar235 * auVar83._12_4_ + fVar80 * auVar105._12_4_ + fVar192 * auVar116._12_4_;
      fVar114 = fVar229 * auVar277._0_4_ + fVar193 * auVar239._0_4_ + fVar160 * auVar130._0_4_;
      fVar126 = fVar230 * auVar277._4_4_ + fVar201 * auVar239._4_4_ + fVar190 * auVar130._4_4_;
      fVar127 = fVar234 * auVar277._8_4_ + fVar202 * auVar239._8_4_ + fVar191 * auVar130._8_4_;
      fVar128 = fVar235 * auVar277._12_4_ + fVar80 * auVar239._12_4_ + fVar192 * auVar130._12_4_;
    }
    else {
      fVar114 = (pIVar9->super_Geometry).fnumTimeSegments;
      fVar126 = (pIVar9->super_Geometry).time_range.lower;
      auVar81._0_4_ = (pIVar9->super_Geometry).time_range.upper - fVar126;
      auVar61._4_4_ = fVar126;
      auVar61._0_4_ = fVar126;
      auVar61._8_4_ = fVar126;
      auVar61._12_4_ = fVar126;
      auVar115._0_4_ = *(float *)(ray + 0x70) - fVar126;
      auVar115._4_4_ = *(float *)(ray + 0x74) - fVar126;
      auVar115._8_4_ = *(float *)(ray + 0x78) - fVar126;
      auVar115._12_4_ = *(float *)(ray + 0x7c) - fVar126;
      auVar81._4_4_ = auVar81._0_4_;
      auVar81._8_4_ = auVar81._0_4_;
      auVar81._12_4_ = auVar81._0_4_;
      auVar116 = divps(auVar115,auVar81);
      auVar117._0_4_ = auVar116._0_4_ * fVar114;
      auVar117._4_4_ = auVar116._4_4_ * fVar114;
      auVar117._8_4_ = auVar116._8_4_ * fVar114;
      auVar117._12_4_ = auVar116._12_4_ * fVar114;
      auVar116 = roundps(auVar61,auVar117,1);
      auVar31._0_4_ = fVar114 + -1.0;
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
      auVar116 = minps(auVar116,auVar31);
      auVar116 = maxps(auVar116,ZEXT816(0));
      fVar114 = auVar117._0_4_ - auVar116._0_4_;
      fVar126 = auVar117._4_4_ - auVar116._4_4_;
      fVar127 = auVar117._8_4_ - auVar116._8_4_;
      fVar128 = auVar117._12_4_ - auVar116._12_4_;
      iVar275 = (int)auVar116._0_4_;
      iVar283 = (int)auVar116._4_4_;
      iVar286 = (int)auVar116._8_4_;
      iVar289 = (int)auVar116._12_4_;
      local_98 = CONCAT44(iVar283,iVar275);
      uStack_90 = (RTCRayQueryContext *)CONCAT44(iVar289,iVar286);
      lVar14 = 0;
      if ((uVar27 & 0xff) != 0) {
        for (; ((uVar27 & 0xff) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
        }
      }
      iVar8 = *(int *)((long)&local_98 + lVar14 * 4);
      auVar32._0_4_ = -(uint)(iVar8 == iVar275);
      auVar32._4_4_ = -(uint)(iVar8 == iVar283);
      auVar32._8_4_ = -(uint)(iVar8 == iVar286);
      auVar32._12_4_ = -(uint)(iVar8 == iVar289);
      iVar28 = movmskps((int)valid_i,~auVar32 & auVar231);
      if (iVar28 == 0) {
        pAVar11 = pIVar9->local2world;
        pAVar13 = pAVar11 + iVar8;
        fVar103 = (pAVar13->l).vx.field_0.m128[0];
        fVar111 = (pAVar13->l).vx.field_0.m128[1];
        fVar203 = (pAVar13->l).vx.field_0.m128[2];
        pVVar2 = &pAVar11[iVar8].l.vy;
        fVar205 = (pVVar2->field_0).m128[0];
        fVar212 = (pVVar2->field_0).m128[1];
        fVar112 = (pVVar2->field_0).m128[2];
        pVVar2 = &pAVar11[iVar8].l.vz;
        fVar113 = (pVVar2->field_0).m128[0];
        fVar247 = (pVVar2->field_0).m128[1];
        fVar29 = (pVVar2->field_0).m128[2];
        pVVar2 = &pAVar11[iVar8].p;
        fVar51 = (pVVar2->field_0).m128[0];
        fVar57 = (pVVar2->field_0).m128[1];
        fVar272 = (pVVar2->field_0).m128[2];
        pAVar13 = pAVar11 + (long)iVar8 + 1;
        fVar54 = (pAVar13->l).vx.field_0.m128[0];
        fVar60 = (pAVar13->l).vx.field_0.m128[1];
        fVar77 = (pAVar13->l).vx.field_0.m128[2];
        pVVar2 = &pAVar11[(long)iVar8 + 1].l.vy;
        fVar78 = (pVVar2->field_0).m128[0];
        fVar79 = (pVVar2->field_0).m128[1];
        fVar80 = (pVVar2->field_0).m128[2];
        fVar256 = 1.0 - fVar114;
        fVar265 = 1.0 - fVar126;
        fVar268 = 1.0 - fVar127;
        fVar271 = 1.0 - fVar128;
        fVar193 = fVar103 * fVar256 + fVar54 * fVar114;
        fVar201 = fVar103 * fVar265 + fVar54 * fVar126;
        fVar202 = fVar103 * fVar268 + fVar54 * fVar127;
        fVar204 = fVar103 * fVar271 + fVar54 * fVar128;
        fVar223 = fVar111 * fVar256 + fVar60 * fVar114;
        fVar227 = fVar111 * fVar265 + fVar60 * fVar126;
        fVar228 = fVar111 * fVar268 + fVar60 * fVar127;
        fVar229 = fVar111 * fVar271 + fVar60 * fVar128;
        pVVar2 = &pAVar11[(long)iVar8 + 1].l.vz;
        fVar103 = (pVVar2->field_0).m128[0];
        fVar111 = (pVVar2->field_0).m128[1];
        fVar54 = (pVVar2->field_0).m128[2];
        fVar230 = fVar203 * fVar256 + fVar77 * fVar114;
        fVar234 = fVar203 * fVar265 + fVar77 * fVar126;
        fVar235 = fVar203 * fVar268 + fVar77 * fVar127;
        fVar236 = fVar203 * fVar271 + fVar77 * fVar128;
        fVar211 = fVar205 * fVar256 + fVar78 * fVar114;
        fVar220 = fVar205 * fVar265 + fVar78 * fVar126;
        fVar221 = fVar205 * fVar268 + fVar78 * fVar127;
        fVar222 = fVar205 * fVar271 + fVar78 * fVar128;
        fVar60 = fVar212 * fVar256 + fVar79 * fVar114;
        fVar77 = fVar212 * fVar265 + fVar79 * fVar126;
        fVar78 = fVar212 * fVar268 + fVar79 * fVar127;
        fVar79 = fVar212 * fVar271 + fVar79 * fVar128;
        pVVar2 = &pAVar11[(long)iVar8 + 1].p;
        fVar203 = (pVVar2->field_0).m128[0];
        fVar205 = (pVVar2->field_0).m128[1];
        fVar212 = (pVVar2->field_0).m128[2];
        fVar248 = fVar112 * fVar256 + fVar80 * fVar114;
        fVar251 = fVar112 * fVar265 + fVar80 * fVar126;
        fVar252 = fVar112 * fVar268 + fVar80 * fVar127;
        fVar253 = fVar112 * fVar271 + fVar80 * fVar128;
        fVar160 = fVar113 * fVar256 + fVar103 * fVar114;
        fVar190 = fVar113 * fVar265 + fVar103 * fVar126;
        fVar191 = fVar113 * fVar268 + fVar103 * fVar127;
        fVar192 = fVar113 * fVar271 + fVar103 * fVar128;
        fVar237 = fVar247 * fVar256 + fVar111 * fVar114;
        fVar245 = fVar247 * fVar265 + fVar111 * fVar126;
        fVar246 = fVar247 * fVar268 + fVar111 * fVar127;
        fVar247 = fVar247 * fVar271 + fVar111 * fVar128;
        fVar103 = fVar29 * fVar256 + fVar54 * fVar114;
        fVar111 = fVar29 * fVar265 + fVar54 * fVar126;
        fVar112 = fVar29 * fVar268 + fVar54 * fVar127;
        fVar113 = fVar29 * fVar271 + fVar54 * fVar128;
        fVar80 = fVar51 * fVar256 + fVar203 * fVar114;
        fVar100 = fVar51 * fVar265 + fVar203 * fVar126;
        fVar101 = fVar51 * fVar268 + fVar203 * fVar127;
        fVar102 = fVar51 * fVar271 + fVar203 * fVar128;
        fVar29 = fVar57 * fVar256 + fVar205 * fVar114;
        fVar51 = fVar57 * fVar265 + fVar205 * fVar126;
        fVar54 = fVar57 * fVar268 + fVar205 * fVar127;
        fVar57 = fVar57 * fVar271 + fVar205 * fVar128;
        fVar256 = fVar256 * fVar272 + fVar212 * fVar114;
        fVar265 = fVar265 * fVar272 + fVar212 * fVar126;
        fVar268 = fVar268 * fVar272 + fVar212 * fVar127;
        fVar272 = fVar271 * fVar272 + fVar212 * fVar128;
        auVar62._0_4_ = fVar60 * fVar103 - fVar248 * fVar237;
        auVar62._4_4_ = fVar77 * fVar111 - fVar251 * fVar245;
        auVar62._8_4_ = fVar78 * fVar112 - fVar252 * fVar246;
        auVar62._12_4_ = fVar79 * fVar113 - fVar253 * fVar247;
        fVar114 = fVar248 * fVar160 - fVar211 * fVar103;
        fVar126 = fVar251 * fVar190 - fVar220 * fVar111;
        auVar118._4_4_ = fVar126;
        auVar118._0_4_ = fVar114;
        fVar127 = fVar252 * fVar191 - fVar221 * fVar112;
        fVar128 = fVar253 * fVar192 - fVar222 * fVar113;
        auVar213._0_4_ = fVar211 * fVar237 - fVar60 * fVar160;
        auVar213._4_4_ = fVar220 * fVar245 - fVar77 * fVar190;
        auVar213._8_4_ = fVar221 * fVar246 - fVar78 * fVar191;
        auVar213._12_4_ = fVar222 * fVar247 - fVar79 * fVar192;
        auVar82._0_4_ = fVar230 * fVar237 - fVar223 * fVar103;
        auVar82._4_4_ = fVar234 * fVar245 - fVar227 * fVar111;
        auVar82._8_4_ = fVar235 * fVar246 - fVar228 * fVar112;
        auVar82._12_4_ = fVar236 * fVar247 - fVar229 * fVar113;
        auVar104._0_4_ = fVar103 * fVar193 - fVar230 * fVar160;
        auVar104._4_4_ = fVar111 * fVar201 - fVar234 * fVar190;
        auVar104._8_4_ = fVar112 * fVar202 - fVar235 * fVar191;
        auVar104._12_4_ = fVar113 * fVar204 - fVar236 * fVar192;
        auVar161._0_4_ = fVar160 * fVar223 - fVar237 * fVar193;
        auVar161._4_4_ = fVar190 * fVar227 - fVar245 * fVar201;
        auVar161._8_4_ = fVar191 * fVar228 - fVar246 * fVar202;
        auVar161._12_4_ = fVar192 * fVar229 - fVar247 * fVar204;
        auVar276._4_4_ = fVar227 * fVar251 - fVar234 * fVar77;
        auVar276._0_4_ = fVar223 * fVar248 - fVar230 * fVar60;
        auVar238._0_4_ = fVar230 * fVar211 - fVar248 * fVar193;
        auVar238._4_4_ = fVar234 * fVar220 - fVar251 * fVar201;
        auVar238._8_4_ = fVar235 * fVar221 - fVar252 * fVar202;
        auVar238._12_4_ = fVar236 * fVar222 - fVar253 * fVar204;
        auVar276._8_4_ = fVar228 * fVar252 - fVar235 * fVar78;
        auVar276._12_4_ = fVar229 * fVar253 - fVar236 * fVar79;
        auVar129._0_4_ = fVar60 * fVar193 - fVar211 * fVar223;
        auVar129._4_4_ = fVar77 * fVar201 - fVar220 * fVar227;
        auVar129._8_4_ = fVar78 * fVar202 - fVar221 * fVar228;
        auVar129._12_4_ = fVar79 * fVar204 - fVar222 * fVar229;
        auVar118._8_4_ = fVar127;
        auVar118._12_4_ = fVar128;
        auVar194._0_4_ = fVar193 * auVar62._0_4_ + fVar223 * fVar114 + fVar230 * auVar213._0_4_;
        auVar194._4_4_ = fVar201 * auVar62._4_4_ + fVar227 * fVar126 + fVar234 * auVar213._4_4_;
        auVar194._8_4_ = fVar202 * auVar62._8_4_ + fVar228 * fVar127 + fVar235 * auVar213._8_4_;
        auVar194._12_4_ = fVar204 * auVar62._12_4_ + fVar229 * fVar128 + fVar236 * auVar213._12_4_;
        auVar231 = divps(auVar62,auVar194);
        auVar83 = divps(auVar82,auVar194);
        auVar277 = divps(auVar276,auVar194);
        auVar119 = divps(auVar118,auVar194);
        auVar105 = divps(auVar104,auVar194);
        auVar239 = divps(auVar238,auVar194);
        auVar214 = divps(auVar213,auVar194);
        auVar116 = divps(auVar161,auVar194);
        auVar130 = divps(auVar129,auVar194);
        fVar103 = fVar80 * auVar231._0_4_ + fVar29 * auVar119._0_4_ + fVar256 * auVar214._0_4_;
        fVar111 = fVar100 * auVar231._4_4_ + fVar51 * auVar119._4_4_ + fVar265 * auVar214._4_4_;
        fVar203 = fVar101 * auVar231._8_4_ + fVar54 * auVar119._8_4_ + fVar268 * auVar214._8_4_;
        fVar205 = fVar102 * auVar231._12_4_ + fVar57 * auVar119._12_4_ + fVar272 * auVar214._12_4_;
        fVar212 = fVar80 * auVar83._0_4_ + fVar29 * auVar105._0_4_ + fVar256 * auVar116._0_4_;
        fVar112 = fVar100 * auVar83._4_4_ + fVar51 * auVar105._4_4_ + fVar265 * auVar116._4_4_;
        fVar113 = fVar101 * auVar83._8_4_ + fVar54 * auVar105._8_4_ + fVar268 * auVar116._8_4_;
        fVar247 = fVar102 * auVar83._12_4_ + fVar57 * auVar105._12_4_ + fVar272 * auVar116._12_4_;
        fVar114 = fVar80 * auVar277._0_4_ + fVar29 * auVar239._0_4_ + fVar256 * auVar130._0_4_;
        fVar126 = fVar100 * auVar277._4_4_ + fVar51 * auVar239._4_4_ + fVar265 * auVar130._4_4_;
        fVar127 = fVar101 * auVar277._8_4_ + fVar54 * auVar239._8_4_ + fVar268 * auVar130._8_4_;
        fVar128 = fVar102 * auVar277._12_4_ + fVar57 * auVar239._12_4_ + fVar272 * auVar130._12_4_;
      }
      else {
        pAVar13 = pIVar9->local2world;
        do {
          lVar14 = 0;
          if ((uVar27 & 0xf) != 0) {
            for (; ((uVar27 & 0xf) >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          iVar8 = *(int *)((long)&local_98 + (long)(int)lVar14 * 4);
          auVar40._0_4_ = -(uint)(iVar8 == iVar275);
          auVar40._4_4_ = -(uint)(iVar8 == iVar283);
          auVar40._8_4_ = -(uint)(iVar8 == iVar286);
          auVar40._12_4_ = -(uint)(iVar8 == iVar289);
          auVar40 = auVar40 & auVar231;
          pAVar11 = pAVar13 + iVar8;
          uVar15 = *(undefined4 *)&(pAVar11->l).vx.field_0;
          uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
          uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
          auVar132._4_4_ = uVar15;
          auVar132._0_4_ = uVar15;
          auVar132._8_4_ = uVar15;
          auVar132._12_4_ = uVar15;
          auVar116 = blendvps(auVar116,auVar132,auVar40);
          auVar133._4_4_ = uVar16;
          auVar133._0_4_ = uVar16;
          auVar133._8_4_ = uVar16;
          auVar133._12_4_ = uVar16;
          in_XMM13 = blendvps(in_XMM13,auVar133,auVar40);
          pVVar2 = &pAVar13[iVar8].l.vy;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar86._4_4_ = uVar17;
          auVar86._0_4_ = uVar17;
          auVar86._8_4_ = uVar17;
          auVar86._12_4_ = uVar17;
          in_XMM6 = blendvps(in_XMM6,auVar86,auVar40);
          auVar87._4_4_ = uVar15;
          auVar87._0_4_ = uVar15;
          auVar87._8_4_ = uVar15;
          auVar87._12_4_ = uVar15;
          _local_1d8 = blendvps(_local_1d8,auVar87,auVar40);
          auVar88._4_4_ = uVar16;
          auVar88._0_4_ = uVar16;
          auVar88._8_4_ = uVar16;
          auVar88._12_4_ = uVar16;
          _local_248 = blendvps(_local_248,auVar88,auVar40);
          pVVar2 = &pAVar13[iVar8].l.vz;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar134._4_4_ = uVar18;
          auVar134._0_4_ = uVar18;
          auVar134._8_4_ = uVar18;
          auVar134._12_4_ = uVar18;
          _local_238 = blendvps(_local_238,auVar134,auVar40);
          auVar135._4_4_ = uVar15;
          auVar135._0_4_ = uVar15;
          auVar135._8_4_ = uVar15;
          auVar135._12_4_ = uVar15;
          _local_228 = blendvps(_local_228,auVar135,auVar40);
          auVar136._4_4_ = uVar16;
          auVar136._0_4_ = uVar16;
          auVar136._8_4_ = uVar16;
          auVar136._12_4_ = uVar16;
          _local_1e8 = blendvps(_local_1e8,auVar136,auVar40);
          pVVar2 = &pAVar13[iVar8].p;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar89._4_4_ = uVar17;
          auVar89._0_4_ = uVar17;
          auVar89._8_4_ = uVar17;
          auVar89._12_4_ = uVar17;
          _local_208 = blendvps(_local_208,auVar89,auVar40);
          auVar90._4_4_ = uVar15;
          auVar90._0_4_ = uVar15;
          auVar90._8_4_ = uVar15;
          auVar90._12_4_ = uVar15;
          _local_258 = blendvps(_local_258,auVar90,auVar40);
          auVar91._4_4_ = uVar16;
          auVar91._0_4_ = uVar16;
          auVar91._8_4_ = uVar16;
          auVar91._12_4_ = uVar16;
          _local_218 = blendvps(_local_218,auVar91,auVar40);
          auVar137._4_4_ = uVar18;
          auVar137._0_4_ = uVar18;
          auVar137._8_4_ = uVar18;
          auVar137._12_4_ = uVar18;
          _local_178 = blendvps(_local_178,auVar137,auVar40);
          pAVar11 = pAVar13 + (long)iVar8 + 1;
          uVar15 = *(undefined4 *)&(pAVar11->l).vx.field_0;
          uVar16 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 4);
          uVar17 = *(undefined4 *)((long)&(pAVar11->l).vx.field_0 + 8);
          auVar138._4_4_ = uVar15;
          auVar138._0_4_ = uVar15;
          auVar138._8_4_ = uVar15;
          auVar138._12_4_ = uVar15;
          in_XMM7 = blendvps(in_XMM7,auVar138,auVar40);
          auVar139._4_4_ = uVar16;
          auVar139._0_4_ = uVar16;
          auVar139._8_4_ = uVar16;
          auVar139._12_4_ = uVar16;
          in_XMM10 = blendvps(in_XMM10,auVar139,auVar40);
          pVVar2 = &pAVar13[(long)iVar8 + 1].l.vy;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar92._4_4_ = uVar17;
          auVar92._0_4_ = uVar17;
          auVar92._8_4_ = uVar17;
          auVar92._12_4_ = uVar17;
          in_XMM12 = blendvps(in_XMM12,auVar92,auVar40);
          auVar93._4_4_ = uVar15;
          auVar93._0_4_ = uVar15;
          auVar93._8_4_ = uVar15;
          auVar93._12_4_ = uVar15;
          in_XMM9 = blendvps(in_XMM9,auVar93,auVar40);
          auVar94._4_4_ = uVar16;
          auVar94._0_4_ = uVar16;
          auVar94._8_4_ = uVar16;
          auVar94._12_4_ = uVar16;
          in_XMM8 = blendvps(in_XMM8,auVar94,auVar40);
          pVVar2 = &pAVar13[(long)iVar8 + 1].l.vz;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar17 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar140._4_4_ = uVar18;
          auVar140._0_4_ = uVar18;
          auVar140._8_4_ = uVar18;
          auVar140._12_4_ = uVar18;
          in_XMM14 = blendvps(in_XMM14,auVar140,auVar40);
          auVar141._4_4_ = uVar15;
          auVar141._0_4_ = uVar15;
          auVar141._8_4_ = uVar15;
          auVar141._12_4_ = uVar15;
          _local_1c8 = blendvps(_local_1c8,auVar141,auVar40);
          auVar142._4_4_ = uVar16;
          auVar142._0_4_ = uVar16;
          auVar142._8_4_ = uVar16;
          auVar142._12_4_ = uVar16;
          _local_1f8 = blendvps(_local_1f8,auVar142,auVar40);
          pVVar2 = &pAVar13[(long)iVar8 + 1].p;
          uVar15 = *(undefined4 *)&pVVar2->field_0;
          uVar16 = *(undefined4 *)((long)&pVVar2->field_0 + 4);
          uVar18 = *(undefined4 *)((long)&pVVar2->field_0 + 8);
          auVar95._4_4_ = uVar17;
          auVar95._0_4_ = uVar17;
          auVar95._8_4_ = uVar17;
          auVar95._12_4_ = uVar17;
          _local_1b8 = blendvps(_local_1b8,auVar95,auVar40);
          auVar96._4_4_ = uVar15;
          auVar96._0_4_ = uVar15;
          auVar96._8_4_ = uVar15;
          auVar96._12_4_ = uVar15;
          _local_1a8 = blendvps(_local_1a8,auVar96,auVar40);
          auVar97._4_4_ = uVar16;
          auVar97._0_4_ = uVar16;
          auVar97._8_4_ = uVar16;
          auVar97._12_4_ = uVar16;
          _local_198 = blendvps(_local_198,auVar97,auVar40);
          auVar143._4_4_ = uVar18;
          auVar143._0_4_ = uVar18;
          auVar143._8_4_ = uVar18;
          auVar143._12_4_ = uVar18;
          _local_188 = blendvps(_local_188,auVar143,auVar40);
          auVar231 = auVar231 ^ auVar40;
          uVar27 = movmskps(iVar8 * 0x40,auVar231);
        } while (uVar27 != 0);
        fVar229 = 1.0 - fVar114;
        fVar230 = 1.0 - fVar126;
        fVar234 = 1.0 - fVar127;
        fVar235 = 1.0 - fVar128;
        fVar212 = auVar116._0_4_ * fVar229 + in_XMM7._0_4_ * fVar114;
        fVar112 = auVar116._4_4_ * fVar230 + in_XMM7._4_4_ * fVar126;
        fVar113 = auVar116._8_4_ * fVar234 + in_XMM7._8_4_ * fVar127;
        fVar247 = auVar116._12_4_ * fVar235 + in_XMM7._12_4_ * fVar128;
        fVar29 = in_XMM13._0_4_ * fVar229 + in_XMM10._0_4_ * fVar114;
        fVar51 = in_XMM13._4_4_ * fVar230 + in_XMM10._4_4_ * fVar126;
        fVar57 = in_XMM13._8_4_ * fVar234 + in_XMM10._8_4_ * fVar127;
        fVar272 = in_XMM13._12_4_ * fVar235 + in_XMM10._12_4_ * fVar128;
        fVar248 = in_XMM6._0_4_ * fVar229 + in_XMM12._0_4_ * fVar114;
        fVar251 = in_XMM6._4_4_ * fVar230 + in_XMM12._4_4_ * fVar126;
        fVar252 = in_XMM6._8_4_ * fVar234 + in_XMM12._8_4_ * fVar127;
        fVar253 = in_XMM6._12_4_ * fVar235 + in_XMM12._12_4_ * fVar128;
        fVar102 = (float)local_1d8._0_4_ * fVar229 + in_XMM9._0_4_ * fVar114;
        fVar160 = (float)local_1d8._4_4_ * fVar230 + in_XMM9._4_4_ * fVar126;
        fVar190 = fStack_1d0 * fVar234 + in_XMM9._8_4_ * fVar127;
        fVar191 = fStack_1cc * fVar235 + in_XMM9._12_4_ * fVar128;
        fVar103 = (float)local_248._0_4_ * fVar229 + in_XMM8._0_4_ * fVar114;
        fVar111 = (float)local_248._4_4_ * fVar230 + in_XMM8._4_4_ * fVar126;
        fVar203 = (float)uStack_240 * fVar234 + in_XMM8._8_4_ * fVar127;
        fVar205 = uStack_240._4_4_ * fVar235 + in_XMM8._12_4_ * fVar128;
        fVar204 = (float)local_238._0_4_ * fVar229 + in_XMM14._0_4_ * fVar114;
        fVar211 = (float)local_238._4_4_ * fVar230 + in_XMM14._4_4_ * fVar126;
        fVar220 = (float)uStack_230 * fVar234 + in_XMM14._8_4_ * fVar127;
        fVar221 = uStack_230._4_4_ * fVar235 + in_XMM14._12_4_ * fVar128;
        fVar222 = (float)local_228._0_4_ * fVar229 + (float)local_1c8._0_4_ * fVar114;
        fVar223 = (float)local_228._4_4_ * fVar230 + (float)local_1c8._4_4_ * fVar126;
        fVar227 = (float)uStack_220 * fVar234 + fStack_1c0 * fVar127;
        fVar228 = uStack_220._4_4_ * fVar235 + fStack_1bc * fVar128;
        fVar236 = (float)local_1e8._0_4_ * fVar229 + (float)local_1f8._0_4_ * fVar114;
        fVar237 = (float)local_1e8._4_4_ * fVar230 + (float)local_1f8._4_4_ * fVar126;
        fVar245 = fStack_1e0 * fVar234 + fStack_1f0 * fVar127;
        fVar246 = fStack_1dc * fVar235 + fStack_1ec * fVar128;
        fVar54 = (float)local_208._0_4_ * fVar229 + (float)local_1b8._0_4_ * fVar114;
        fVar60 = (float)local_208._4_4_ * fVar230 + (float)local_1b8._4_4_ * fVar126;
        fVar77 = (float)uStack_200 * fVar234 + fStack_1b0 * fVar127;
        fVar78 = uStack_200._4_4_ * fVar235 + fStack_1ac * fVar128;
        fVar79 = (float)local_258._0_4_ * fVar229 + (float)local_1a8._0_4_ * fVar114;
        fVar80 = (float)local_258._4_4_ * fVar230 + (float)local_1a8._4_4_ * fVar126;
        fVar100 = (float)uStack_250 * fVar234 + fStack_1a0 * fVar127;
        fVar101 = uStack_250._4_4_ * fVar235 + fStack_19c * fVar128;
        fVar192 = (float)local_218._0_4_ * fVar229 + (float)local_198._0_4_ * fVar114;
        fVar193 = (float)local_218._4_4_ * fVar230 + (float)local_198._4_4_ * fVar126;
        fVar201 = (float)uStack_210 * fVar234 + fStack_190 * fVar127;
        fVar202 = uStack_210._4_4_ * fVar235 + fStack_18c * fVar128;
        fVar114 = fVar229 * (float)local_178._0_4_ + (float)local_188._0_4_ * fVar114;
        fVar126 = fVar230 * (float)local_178._4_4_ + (float)local_188._4_4_ * fVar126;
        fVar127 = fVar234 * fStack_170 + fStack_180 * fVar127;
        fVar128 = fVar235 * fStack_16c + fStack_17c * fVar128;
        auVar263._0_4_ = fVar103 * fVar54 - fVar204 * fVar236;
        auVar263._4_4_ = fVar111 * fVar60 - fVar211 * fVar237;
        auVar263._8_4_ = fVar203 * fVar77 - fVar220 * fVar245;
        auVar263._12_4_ = fVar205 * fVar78 - fVar221 * fVar246;
        auVar123._0_4_ = fVar204 * fVar222 - fVar102 * fVar54;
        auVar123._4_4_ = fVar211 * fVar223 - fVar160 * fVar60;
        auVar123._8_4_ = fVar220 * fVar227 - fVar190 * fVar77;
        auVar123._12_4_ = fVar221 * fVar228 - fVar191 * fVar78;
        auVar195._0_4_ = fVar102 * fVar236 - fVar103 * fVar222;
        auVar195._4_4_ = fVar160 * fVar237 - fVar111 * fVar223;
        auVar195._8_4_ = fVar190 * fVar245 - fVar203 * fVar227;
        auVar195._12_4_ = fVar191 * fVar246 - fVar205 * fVar228;
        auVar98._4_4_ = fVar251 * fVar237 - fVar51 * fVar60;
        auVar98._0_4_ = fVar248 * fVar236 - fVar29 * fVar54;
        auVar109._0_4_ = fVar54 * fVar212 - fVar248 * fVar222;
        auVar109._4_4_ = fVar60 * fVar112 - fVar251 * fVar223;
        auVar109._8_4_ = fVar77 * fVar113 - fVar252 * fVar227;
        auVar109._12_4_ = fVar78 * fVar247 - fVar253 * fVar228;
        auVar226._0_4_ = fVar222 * fVar29 - fVar236 * fVar212;
        auVar226._4_4_ = fVar223 * fVar51 - fVar237 * fVar112;
        auVar226._8_4_ = fVar227 * fVar57 - fVar245 * fVar113;
        auVar226._12_4_ = fVar228 * fVar272 - fVar246 * fVar247;
        auVar281._0_4_ = fVar29 * fVar204 - fVar248 * fVar103;
        auVar281._4_4_ = fVar51 * fVar211 - fVar251 * fVar111;
        auVar281._8_4_ = fVar57 * fVar220 - fVar252 * fVar203;
        auVar281._12_4_ = fVar272 * fVar221 - fVar253 * fVar205;
        auVar242._0_4_ = fVar248 * fVar102 - fVar204 * fVar212;
        auVar242._4_4_ = fVar251 * fVar160 - fVar211 * fVar112;
        auVar242._8_4_ = fVar252 * fVar190 - fVar220 * fVar113;
        auVar242._12_4_ = fVar253 * fVar191 - fVar221 * fVar247;
        auVar144._4_4_ = fVar111 * fVar112 - fVar160 * fVar51;
        auVar144._0_4_ = fVar103 * fVar212 - fVar102 * fVar29;
        auVar144._8_4_ = fVar203 * fVar113 - fVar190 * fVar57;
        auVar144._12_4_ = fVar205 * fVar247 - fVar191 * fVar272;
        auVar74._0_4_ =
             fVar212 * auVar263._0_4_ + fVar29 * auVar123._0_4_ + fVar248 * auVar195._0_4_;
        auVar74._4_4_ =
             fVar112 * auVar263._4_4_ + fVar51 * auVar123._4_4_ + fVar251 * auVar195._4_4_;
        auVar74._8_4_ =
             fVar113 * auVar263._8_4_ + fVar57 * auVar123._8_4_ + fVar252 * auVar195._8_4_;
        auVar74._12_4_ =
             fVar247 * auVar263._12_4_ + fVar272 * auVar123._12_4_ + fVar253 * auVar195._12_4_;
        auVar98._8_4_ = fVar252 * fVar245 - fVar57 * fVar77;
        auVar98._12_4_ = fVar253 * fVar246 - fVar272 * fVar78;
        auVar231 = divps(auVar263,auVar74);
        auVar83 = divps(auVar98,auVar74);
        auVar277 = divps(auVar281,auVar74);
        auVar119 = divps(auVar123,auVar74);
        auVar105 = divps(auVar109,auVar74);
        auVar239 = divps(auVar242,auVar74);
        auVar214 = divps(auVar195,auVar74);
        auVar116 = divps(auVar226,auVar74);
        auVar130 = divps(auVar144,auVar74);
        fVar103 = fVar79 * auVar231._0_4_ + fVar192 * auVar119._0_4_ + fVar114 * auVar214._0_4_;
        fVar111 = fVar80 * auVar231._4_4_ + fVar193 * auVar119._4_4_ + fVar126 * auVar214._4_4_;
        fVar203 = fVar100 * auVar231._8_4_ + fVar201 * auVar119._8_4_ + fVar127 * auVar214._8_4_;
        fVar205 = fVar101 * auVar231._12_4_ + fVar202 * auVar119._12_4_ + fVar128 * auVar214._12_4_;
        fVar212 = fVar79 * auVar83._0_4_ + fVar192 * auVar105._0_4_ + fVar114 * auVar116._0_4_;
        fVar112 = fVar80 * auVar83._4_4_ + fVar193 * auVar105._4_4_ + fVar126 * auVar116._4_4_;
        fVar113 = fVar100 * auVar83._8_4_ + fVar201 * auVar105._8_4_ + fVar127 * auVar116._8_4_;
        fVar247 = fVar101 * auVar83._12_4_ + fVar202 * auVar105._12_4_ + fVar128 * auVar116._12_4_;
        fVar114 = fVar79 * auVar277._0_4_ + fVar192 * auVar239._0_4_ + fVar114 * auVar130._0_4_;
        fVar126 = fVar80 * auVar277._4_4_ + fVar193 * auVar239._4_4_ + fVar126 * auVar130._4_4_;
        fVar127 = fVar100 * auVar277._8_4_ + fVar201 * auVar239._8_4_ + fVar127 * auVar130._8_4_;
        fVar128 = fVar101 * auVar277._12_4_ + fVar202 * auVar239._12_4_ + fVar128 * auVar130._12_4_;
      }
    }
    pRVar1 = ray + 0x10;
    fVar29 = *(float *)pRVar1;
    fVar51 = *(float *)(ray + 0x14);
    fVar57 = *(float *)(ray + 0x18);
    auVar20 = *(undefined1 (*) [12])pRVar1;
    fVar272 = *(float *)(ray + 0x1c);
    auVar41 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x20;
    fVar54 = *(float *)pRVar1;
    fVar60 = *(float *)(ray + 0x24);
    fVar77 = *(float *)(ray + 0x28);
    auVar21 = *(undefined1 (*) [12])pRVar1;
    fVar78 = *(float *)(ray + 0x2c);
    auVar145 = *(undefined1 (*) [16])pRVar1;
    fVar79 = *(float *)ray;
    fVar80 = *(float *)(ray + 4);
    fVar100 = *(float *)(ray + 8);
    auVar22 = *(undefined1 (*) [12])ray;
    fVar101 = *(float *)(ray + 0xc);
    auVar146 = *(undefined1 (*) [16])ray;
    pRVar1 = ray + 0x40;
    fVar102 = *(float *)pRVar1;
    fVar160 = *(float *)(ray + 0x44);
    fVar190 = *(float *)(ray + 0x48);
    auVar25 = *(undefined1 (*) [12])pRVar1;
    fVar191 = *(float *)(ray + 0x4c);
    auVar149 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x50;
    fVar192 = *(float *)pRVar1;
    fVar193 = *(float *)(ray + 0x54);
    fVar201 = *(float *)(ray + 0x58);
    auVar24 = *(undefined1 (*) [12])pRVar1;
    fVar202 = *(float *)(ray + 0x5c);
    auVar148 = *(undefined1 (*) [16])pRVar1;
    pRVar1 = ray + 0x60;
    fVar204 = *(float *)pRVar1;
    fVar211 = *(float *)(ray + 100);
    fVar220 = *(float *)(ray + 0x68);
    auVar23 = *(undefined1 (*) [12])pRVar1;
    fVar221 = *(float *)(ray + 0x6c);
    auVar147 = *(undefined1 (*) [16])pRVar1;
    *(float *)ray =
         auVar231._0_4_ * fVar79 + auVar119._0_4_ * fVar29 + auVar214._0_4_ * fVar54 + -fVar103;
    *(float *)(ray + 4) =
         auVar231._4_4_ * fVar80 + auVar119._4_4_ * fVar51 + auVar214._4_4_ * fVar60 + -fVar111;
    *(float *)(ray + 8) =
         auVar231._8_4_ * fVar100 + auVar119._8_4_ * fVar57 + auVar214._8_4_ * fVar77 + -fVar203;
    *(float *)(ray + 0xc) =
         auVar231._12_4_ * fVar101 + auVar119._12_4_ * fVar272 + auVar214._12_4_ * fVar78 + -fVar205
    ;
    *(float *)(ray + 0x10) =
         auVar83._0_4_ * fVar79 + auVar105._0_4_ * fVar29 + auVar116._0_4_ * fVar54 + -fVar212;
    *(float *)(ray + 0x14) =
         auVar83._4_4_ * fVar80 + auVar105._4_4_ * fVar51 + auVar116._4_4_ * fVar60 + -fVar112;
    *(float *)(ray + 0x18) =
         auVar83._8_4_ * fVar100 + auVar105._8_4_ * fVar57 + auVar116._8_4_ * fVar77 + -fVar113;
    *(float *)(ray + 0x1c) =
         auVar83._12_4_ * fVar101 + auVar105._12_4_ * fVar272 + auVar116._12_4_ * fVar78 + -fVar247;
    *(float *)(ray + 0x20) =
         auVar277._0_4_ * fVar79 + auVar239._0_4_ * fVar29 + auVar130._0_4_ * fVar54 + -fVar114;
    *(float *)(ray + 0x24) =
         auVar277._4_4_ * fVar80 + auVar239._4_4_ * fVar51 + auVar130._4_4_ * fVar60 + -fVar126;
    *(float *)(ray + 0x28) =
         auVar277._8_4_ * fVar100 + auVar239._8_4_ * fVar57 + auVar130._8_4_ * fVar77 + -fVar127;
    *(float *)(ray + 0x2c) =
         auVar277._12_4_ * fVar101 + auVar239._12_4_ * fVar272 + auVar130._12_4_ * fVar78 + -fVar128
    ;
    *(float *)(ray + 0x40) =
         auVar231._0_4_ * fVar102 + auVar119._0_4_ * fVar192 + auVar214._0_4_ * fVar204;
    *(float *)(ray + 0x44) =
         auVar231._4_4_ * fVar160 + auVar119._4_4_ * fVar193 + auVar214._4_4_ * fVar211;
    *(float *)(ray + 0x48) =
         auVar231._8_4_ * fVar190 + auVar119._8_4_ * fVar201 + auVar214._8_4_ * fVar220;
    *(float *)(ray + 0x4c) =
         auVar231._12_4_ * fVar191 + auVar119._12_4_ * fVar202 + auVar214._12_4_ * fVar221;
    *(float *)(ray + 0x50) =
         auVar83._0_4_ * fVar102 + auVar105._0_4_ * fVar192 + auVar116._0_4_ * fVar204;
    *(float *)(ray + 0x54) =
         auVar83._4_4_ * fVar160 + auVar105._4_4_ * fVar193 + auVar116._4_4_ * fVar211;
    *(float *)(ray + 0x58) =
         auVar83._8_4_ * fVar190 + auVar105._8_4_ * fVar201 + auVar116._8_4_ * fVar220;
    *(float *)(ray + 0x5c) =
         auVar83._12_4_ * fVar191 + auVar105._12_4_ * fVar202 + auVar116._12_4_ * fVar221;
    *(float *)(ray + 0x60) =
         auVar277._0_4_ * fVar102 + auVar239._0_4_ * fVar192 + auVar130._0_4_ * fVar204;
    *(float *)(ray + 100) =
         auVar277._4_4_ * fVar160 + auVar239._4_4_ * fVar193 + auVar130._4_4_ * fVar211;
    *(float *)(ray + 0x68) =
         auVar277._8_4_ * fVar190 + auVar239._8_4_ * fVar201 + auVar130._8_4_ * fVar220;
    *(float *)(ray + 0x6c) =
         auVar277._12_4_ * fVar191 + auVar239._12_4_ * fVar202 + auVar130._12_4_ * fVar221;
    local_98 = *(long *)&(pIVar9->super_Geometry).field_0x58;
    local_88 = context->args;
    local_28 = local_48._0_8_;
    uStack_20 = local_48._8_8_;
    uStack_90 = pRVar10;
    local_48 = auVar26;
    (**(code **)(local_98 + 0x98))(&local_28,local_98 + 0x58,ray);
    local_208 = auVar22._0_8_;
    uStack_200 = auVar146._8_8_;
    *(undefined1 (*) [8])ray = local_208;
    *(undefined8 *)(ray + 8) = uStack_200;
    local_248 = auVar20._0_8_;
    uStack_240 = auVar41._8_8_;
    *(undefined1 (*) [8])(ray + 0x10) = local_248;
    *(undefined8 *)(ray + 0x18) = uStack_240;
    local_258 = auVar21._0_8_;
    uStack_250 = auVar145._8_8_;
    *(undefined1 (*) [8])(ray + 0x20) = local_258;
    *(undefined8 *)(ray + 0x28) = uStack_250;
    local_238 = auVar25._0_8_;
    uStack_230 = auVar149._8_8_;
    *(undefined1 (*) [8])(ray + 0x40) = local_238;
    *(undefined8 *)(ray + 0x48) = uStack_230;
    local_228 = auVar24._0_8_;
    uStack_220 = auVar148._8_8_;
    *(undefined1 (*) [8])(ray + 0x50) = local_228;
    *(undefined8 *)(ray + 0x58) = uStack_220;
    local_218 = auVar23._0_8_;
    uStack_210 = auVar147._8_8_;
    *(undefined1 (*) [8])(ray + 0x60) = local_218;
    *(undefined8 *)(ray + 0x68) = uStack_210;
    pRVar10->instID[0] = 0xffffffff;
    pRVar10->instPrimID[0] = 0xffffffff;
  }
  return;
}

Assistant:

void InstanceIntersectorKMB<K>::intersect(const vbool<K>& valid_i, const Precalculations& pre, RayHitK<K>& ray, RayQueryContext* context, const InstancePrimitive& prim)
    {
      vbool<K> valid = valid_i;
      const Instance* instance = prim.instance;
      
      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      if (likely(instance_id_stack::push(user_context, prim.instID_, 0)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)instance->object, user_context, context->args);
        instance->object->intersectors.intersect(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        instance_id_stack::pop(user_context);
      }
    }